

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::sse2::CurveNiIntersector1<4>::
     intersect_n<embree::sse2::OrientedCurve1Intersector1<embree::CatmullRomCurveT,3,4>,embree::sse2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  Primitive *pPVar1;
  float *pfVar2;
  Primitive PVar3;
  undefined4 uVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  void *pvVar7;
  __int_type_conflict _Var8;
  ulong uVar9;
  undefined1 auVar10 [12];
  undefined1 auVar11 [12];
  undefined1 auVar12 [12];
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  undefined3 uVar15;
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined6 uVar18;
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  anon_union_16_2_47237d3f_for_Vec3fx_0 *paVar34;
  byte bVar35;
  long lVar36;
  ulong uVar38;
  ulong uVar39;
  bool bVar40;
  uint uVar41;
  int iVar42;
  uint uVar43;
  int iVar44;
  uint uVar45;
  uint uVar46;
  short sVar47;
  float fVar48;
  float fVar84;
  float fVar85;
  vfloat_impl<4> p00;
  undefined2 uVar83;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar53 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar60 [16];
  undefined1 auVar63 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar81 [16];
  float fVar86;
  float fVar102;
  float fVar103;
  vfloat4 v;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float t1;
  float fVar104;
  float fVar105;
  float fVar115;
  float fVar116;
  float fVar117;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  float fVar118;
  float fVar123;
  float fVar124;
  vfloat4 v_1;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  float fVar125;
  float fVar138;
  float fVar139;
  vfloat4 a;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  float fVar140;
  float fVar154;
  float fVar155;
  undefined1 auVar141 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  float fVar156;
  undefined8 uVar157;
  float fVar166;
  undefined1 auVar158 [16];
  float fVar165;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  float fVar167;
  float fVar192;
  float fVar193;
  undefined1 auVar168 [16];
  undefined1 auVar171 [16];
  undefined1 auVar174 [16];
  undefined1 auVar177 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  float fVar194;
  float fVar206;
  float fVar207;
  undefined1 auVar195 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  float fVar208;
  float fVar219;
  float fVar220;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  float fVar221;
  float fVar226;
  float fVar227;
  vfloat4 a_1;
  float fVar228;
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  float fVar229;
  float fVar235;
  float fVar236;
  float fVar237;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  float fVar238;
  float fVar239;
  float fVar247;
  undefined8 uVar240;
  float fVar246;
  float fVar248;
  float fVar250;
  undefined1 auVar241 [16];
  float fVar249;
  float fVar251;
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  float fVar252;
  float fVar256;
  float fVar257;
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  vfloat_impl<4> p00_1;
  vfloat_impl<4> p01;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p02;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_428 [8];
  float fStack_420;
  float fStack_41c;
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_3ec;
  float fStack_3dc;
  undefined1 local_3d8 [8];
  float fStack_3d0;
  float fStack_3cc;
  ulong local_3c0;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  undefined1 local_388 [8];
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2c8 [8];
  float fStack_2c0;
  float fStack_2bc;
  undefined1 local_2b8 [8];
  float fStack_2b0;
  float fStack_2ac;
  anon_union_16_2_47237d3f_for_Vec3fx_0 *local_2a0;
  RTCFilterFunctionNArguments local_298;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [16];
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [16];
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  undefined8 local_1f8;
  float fStack_1f0;
  float fStack_1ec;
  float afStack_1e8 [4];
  undefined8 local_1d8;
  float local_1d0;
  float local_1cc;
  float fStack_1c8;
  float local_1c4;
  float local_1c0;
  uint local_1bc;
  uint local_1b8;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  undefined1 local_158 [16];
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  undefined1 local_88 [8];
  float fStack_80;
  float fStack_7c;
  float afStack_78 [8];
  float afStack_58 [10];
  ulong uVar37;
  undefined1 auVar80 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 uVar82;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  
  PVar3 = prim[1];
  uVar39 = (ulong)(byte)PVar3;
  pPVar1 = prim + uVar39 * 0x19 + 6;
  fVar103 = *(float *)(pPVar1 + 0xc);
  fVar118 = ((ray->super_RayK<1>).org.field_0.m128[0] - *(float *)pPVar1) * fVar103;
  fVar123 = ((ray->super_RayK<1>).org.field_0.m128[1] - *(float *)(pPVar1 + 4)) * fVar103;
  fVar124 = ((ray->super_RayK<1>).org.field_0.m128[2] - *(float *)(pPVar1 + 8)) * fVar103;
  fVar86 = fVar103 * (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar102 = fVar103 * (ray->super_RayK<1>).dir.field_0.m128[1];
  fVar103 = fVar103 * (ray->super_RayK<1>).dir.field_0.m128[2];
  uVar4 = *(undefined4 *)(prim + uVar39 * 4 + 6);
  uVar82 = (undefined1)((uint)uVar4 >> 0x18);
  uVar83 = CONCAT11(uVar82,uVar82);
  uVar82 = (undefined1)((uint)uVar4 >> 0x10);
  uVar157 = CONCAT35(CONCAT21(uVar83,uVar82),CONCAT14(uVar82,uVar4));
  uVar82 = (undefined1)((uint)uVar4 >> 8);
  uVar18 = CONCAT51(CONCAT41((int)((ulong)uVar157 >> 0x20),uVar82),uVar82);
  sVar47 = CONCAT11((char)uVar4,(char)uVar4);
  uVar38 = CONCAT62(uVar18,sVar47);
  auVar92._8_4_ = 0;
  auVar92._0_8_ = uVar38;
  auVar92._12_2_ = uVar83;
  auVar92._14_2_ = uVar83;
  uVar83 = (undefined2)((ulong)uVar157 >> 0x20);
  auVar210._12_4_ = auVar92._12_4_;
  auVar210._8_2_ = 0;
  auVar210._0_8_ = uVar38;
  auVar210._10_2_ = uVar83;
  auVar56._10_6_ = auVar210._10_6_;
  auVar56._8_2_ = uVar83;
  auVar56._0_8_ = uVar38;
  uVar83 = (undefined2)uVar18;
  auVar19._4_8_ = auVar56._8_8_;
  auVar19._2_2_ = uVar83;
  auVar19._0_2_ = uVar83;
  fVar104 = (float)((int)sVar47 >> 8);
  fVar115 = (float)(auVar19._0_4_ >> 0x18);
  fVar116 = (float)(auVar56._8_4_ >> 0x18);
  uVar4 = *(undefined4 *)(prim + uVar39 * 5 + 6);
  uVar82 = (undefined1)((uint)uVar4 >> 0x18);
  uVar83 = CONCAT11(uVar82,uVar82);
  uVar82 = (undefined1)((uint)uVar4 >> 0x10);
  uVar157 = CONCAT35(CONCAT21(uVar83,uVar82),CONCAT14(uVar82,uVar4));
  uVar82 = (undefined1)((uint)uVar4 >> 8);
  uVar18 = CONCAT51(CONCAT41((int)((ulong)uVar157 >> 0x20),uVar82),uVar82);
  sVar47 = CONCAT11((char)uVar4,(char)uVar4);
  uVar38 = CONCAT62(uVar18,sVar47);
  auVar49._8_4_ = 0;
  auVar49._0_8_ = uVar38;
  auVar49._12_2_ = uVar83;
  auVar49._14_2_ = uVar83;
  uVar83 = (undefined2)((ulong)uVar157 >> 0x20);
  auVar212._12_4_ = auVar49._12_4_;
  auVar212._8_2_ = 0;
  auVar212._0_8_ = uVar38;
  auVar212._10_2_ = uVar83;
  auVar107._10_6_ = auVar212._10_6_;
  auVar107._8_2_ = uVar83;
  auVar107._0_8_ = uVar38;
  uVar83 = (undefined2)uVar18;
  auVar20._4_8_ = auVar107._8_8_;
  auVar20._2_2_ = uVar83;
  auVar20._0_2_ = uVar83;
  fVar125 = (float)((int)sVar47 >> 8);
  fVar138 = (float)(auVar20._0_4_ >> 0x18);
  fVar139 = (float)(auVar107._8_4_ >> 0x18);
  uVar4 = *(undefined4 *)(prim + uVar39 * 6 + 6);
  uVar82 = (undefined1)((uint)uVar4 >> 0x18);
  uVar83 = CONCAT11(uVar82,uVar82);
  uVar82 = (undefined1)((uint)uVar4 >> 0x10);
  uVar157 = CONCAT35(CONCAT21(uVar83,uVar82),CONCAT14(uVar82,uVar4));
  uVar82 = (undefined1)((uint)uVar4 >> 8);
  uVar18 = CONCAT51(CONCAT41((int)((ulong)uVar157 >> 0x20),uVar82),uVar82);
  sVar47 = CONCAT11((char)uVar4,(char)uVar4);
  uVar38 = CONCAT62(uVar18,sVar47);
  auVar52._8_4_ = 0;
  auVar52._0_8_ = uVar38;
  auVar52._12_2_ = uVar83;
  auVar52._14_2_ = uVar83;
  uVar83 = (undefined2)((ulong)uVar157 >> 0x20);
  auVar51._12_4_ = auVar52._12_4_;
  auVar51._8_2_ = 0;
  auVar51._0_8_ = uVar38;
  auVar51._10_2_ = uVar83;
  auVar50._10_6_ = auVar51._10_6_;
  auVar50._8_2_ = uVar83;
  auVar50._0_8_ = uVar38;
  uVar83 = (undefined2)uVar18;
  auVar21._4_8_ = auVar50._8_8_;
  auVar21._2_2_ = uVar83;
  auVar21._0_2_ = uVar83;
  fVar140 = (float)((int)sVar47 >> 8);
  fVar154 = (float)(auVar21._0_4_ >> 0x18);
  fVar155 = (float)(auVar50._8_4_ >> 0x18);
  uVar4 = *(undefined4 *)(prim + uVar39 * 0xb + 6);
  uVar82 = (undefined1)((uint)uVar4 >> 0x18);
  uVar83 = CONCAT11(uVar82,uVar82);
  uVar82 = (undefined1)((uint)uVar4 >> 0x10);
  uVar157 = CONCAT35(CONCAT21(uVar83,uVar82),CONCAT14(uVar82,uVar4));
  uVar82 = (undefined1)((uint)uVar4 >> 8);
  uVar18 = CONCAT51(CONCAT41((int)((ulong)uVar157 >> 0x20),uVar82),uVar82);
  sVar47 = CONCAT11((char)uVar4,(char)uVar4);
  uVar38 = CONCAT62(uVar18,sVar47);
  auVar55._8_4_ = 0;
  auVar55._0_8_ = uVar38;
  auVar55._12_2_ = uVar83;
  auVar55._14_2_ = uVar83;
  uVar83 = (undefined2)((ulong)uVar157 >> 0x20);
  auVar54._12_4_ = auVar55._12_4_;
  auVar54._8_2_ = 0;
  auVar54._0_8_ = uVar38;
  auVar54._10_2_ = uVar83;
  auVar53._10_6_ = auVar54._10_6_;
  auVar53._8_2_ = uVar83;
  auVar53._0_8_ = uVar38;
  uVar83 = (undefined2)uVar18;
  auVar22._4_8_ = auVar53._8_8_;
  auVar22._2_2_ = uVar83;
  auVar22._0_2_ = uVar83;
  fVar48 = (float)((int)sVar47 >> 8);
  fVar84 = (float)(auVar22._0_4_ >> 0x18);
  fVar85 = (float)(auVar53._8_4_ >> 0x18);
  uVar4 = *(undefined4 *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6);
  uVar82 = (undefined1)((uint)uVar4 >> 0x18);
  uVar83 = CONCAT11(uVar82,uVar82);
  uVar82 = (undefined1)((uint)uVar4 >> 0x10);
  uVar157 = CONCAT35(CONCAT21(uVar83,uVar82),CONCAT14(uVar82,uVar4));
  uVar82 = (undefined1)((uint)uVar4 >> 8);
  uVar18 = CONCAT51(CONCAT41((int)((ulong)uVar157 >> 0x20),uVar82),uVar82);
  sVar47 = CONCAT11((char)uVar4,(char)uVar4);
  uVar38 = CONCAT62(uVar18,sVar47);
  auVar160._8_4_ = 0;
  auVar160._0_8_ = uVar38;
  auVar160._12_2_ = uVar83;
  auVar160._14_2_ = uVar83;
  uVar83 = (undefined2)((ulong)uVar157 >> 0x20);
  auVar159._12_4_ = auVar160._12_4_;
  auVar159._8_2_ = 0;
  auVar159._0_8_ = uVar38;
  auVar159._10_2_ = uVar83;
  auVar158._10_6_ = auVar159._10_6_;
  auVar158._8_2_ = uVar83;
  auVar158._0_8_ = uVar38;
  uVar83 = (undefined2)uVar18;
  auVar23._4_8_ = auVar158._8_8_;
  auVar23._2_2_ = uVar83;
  auVar23._0_2_ = uVar83;
  fVar156 = (float)((int)sVar47 >> 8);
  fVar165 = (float)(auVar23._0_4_ >> 0x18);
  fVar166 = (float)(auVar158._8_4_ >> 0x18);
  uVar4 = *(undefined4 *)(prim + (uint)(byte)PVar3 * 0xc + uVar39 + 6);
  uVar82 = (undefined1)((uint)uVar4 >> 0x18);
  uVar83 = CONCAT11(uVar82,uVar82);
  uVar82 = (undefined1)((uint)uVar4 >> 0x10);
  uVar157 = CONCAT35(CONCAT21(uVar83,uVar82),CONCAT14(uVar82,uVar4));
  uVar82 = (undefined1)((uint)uVar4 >> 8);
  uVar18 = CONCAT51(CONCAT41((int)((ulong)uVar157 >> 0x20),uVar82),uVar82);
  sVar47 = CONCAT11((char)uVar4,(char)uVar4);
  uVar38 = CONCAT62(uVar18,sVar47);
  auVar170._8_4_ = 0;
  auVar170._0_8_ = uVar38;
  auVar170._12_2_ = uVar83;
  auVar170._14_2_ = uVar83;
  uVar83 = (undefined2)((ulong)uVar157 >> 0x20);
  auVar169._12_4_ = auVar170._12_4_;
  auVar169._8_2_ = 0;
  auVar169._0_8_ = uVar38;
  auVar169._10_2_ = uVar83;
  auVar168._10_6_ = auVar169._10_6_;
  auVar168._8_2_ = uVar83;
  auVar168._0_8_ = uVar38;
  uVar83 = (undefined2)uVar18;
  auVar24._4_8_ = auVar168._8_8_;
  auVar24._2_2_ = uVar83;
  auVar24._0_2_ = uVar83;
  fVar208 = (float)((int)sVar47 >> 8);
  fVar219 = (float)(auVar24._0_4_ >> 0x18);
  fVar220 = (float)(auVar168._8_4_ >> 0x18);
  uVar37 = (ulong)(uint)((int)(uVar39 * 9) * 2);
  uVar4 = *(undefined4 *)(prim + uVar37 + 6);
  uVar82 = (undefined1)((uint)uVar4 >> 0x18);
  uVar83 = CONCAT11(uVar82,uVar82);
  uVar82 = (undefined1)((uint)uVar4 >> 0x10);
  uVar157 = CONCAT35(CONCAT21(uVar83,uVar82),CONCAT14(uVar82,uVar4));
  uVar82 = (undefined1)((uint)uVar4 >> 8);
  uVar18 = CONCAT51(CONCAT41((int)((ulong)uVar157 >> 0x20),uVar82),uVar82);
  sVar47 = CONCAT11((char)uVar4,(char)uVar4);
  uVar38 = CONCAT62(uVar18,sVar47);
  auVar173._8_4_ = 0;
  auVar173._0_8_ = uVar38;
  auVar173._12_2_ = uVar83;
  auVar173._14_2_ = uVar83;
  uVar83 = (undefined2)((ulong)uVar157 >> 0x20);
  auVar172._12_4_ = auVar173._12_4_;
  auVar172._8_2_ = 0;
  auVar172._0_8_ = uVar38;
  auVar172._10_2_ = uVar83;
  auVar171._10_6_ = auVar172._10_6_;
  auVar171._8_2_ = uVar83;
  auVar171._0_8_ = uVar38;
  uVar83 = (undefined2)uVar18;
  auVar25._4_8_ = auVar171._8_8_;
  auVar25._2_2_ = uVar83;
  auVar25._0_2_ = uVar83;
  fVar194 = (float)((int)sVar47 >> 8);
  fVar206 = (float)(auVar25._0_4_ >> 0x18);
  fVar207 = (float)(auVar171._8_4_ >> 0x18);
  uVar4 = *(undefined4 *)(prim + uVar37 + uVar39 + 6);
  uVar82 = (undefined1)((uint)uVar4 >> 0x18);
  uVar83 = CONCAT11(uVar82,uVar82);
  uVar82 = (undefined1)((uint)uVar4 >> 0x10);
  uVar157 = CONCAT35(CONCAT21(uVar83,uVar82),CONCAT14(uVar82,uVar4));
  uVar82 = (undefined1)((uint)uVar4 >> 8);
  uVar18 = CONCAT51(CONCAT41((int)((ulong)uVar157 >> 0x20),uVar82),uVar82);
  sVar47 = CONCAT11((char)uVar4,(char)uVar4);
  uVar38 = CONCAT62(uVar18,sVar47);
  auVar176._8_4_ = 0;
  auVar176._0_8_ = uVar38;
  auVar176._12_2_ = uVar83;
  auVar176._14_2_ = uVar83;
  uVar83 = (undefined2)((ulong)uVar157 >> 0x20);
  auVar175._12_4_ = auVar176._12_4_;
  auVar175._8_2_ = 0;
  auVar175._0_8_ = uVar38;
  auVar175._10_2_ = uVar83;
  auVar174._10_6_ = auVar175._10_6_;
  auVar174._8_2_ = uVar83;
  auVar174._0_8_ = uVar38;
  uVar83 = (undefined2)uVar18;
  auVar26._4_8_ = auVar174._8_8_;
  auVar26._2_2_ = uVar83;
  auVar26._0_2_ = uVar83;
  fVar221 = (float)((int)sVar47 >> 8);
  fVar226 = (float)(auVar26._0_4_ >> 0x18);
  fVar227 = (float)(auVar174._8_4_ >> 0x18);
  uVar37 = (ulong)(uint)((int)(uVar39 * 5) << 2);
  uVar4 = *(undefined4 *)(prim + uVar37 + 6);
  uVar82 = (undefined1)((uint)uVar4 >> 0x18);
  uVar83 = CONCAT11(uVar82,uVar82);
  uVar82 = (undefined1)((uint)uVar4 >> 0x10);
  uVar157 = CONCAT35(CONCAT21(uVar83,uVar82),CONCAT14(uVar82,uVar4));
  uVar82 = (undefined1)((uint)uVar4 >> 8);
  uVar18 = CONCAT51(CONCAT41((int)((ulong)uVar157 >> 0x20),uVar82),uVar82);
  sVar47 = CONCAT11((char)uVar4,(char)uVar4);
  uVar38 = CONCAT62(uVar18,sVar47);
  auVar179._8_4_ = 0;
  auVar179._0_8_ = uVar38;
  auVar179._12_2_ = uVar83;
  auVar179._14_2_ = uVar83;
  uVar83 = (undefined2)((ulong)uVar157 >> 0x20);
  auVar178._12_4_ = auVar179._12_4_;
  auVar178._8_2_ = 0;
  auVar178._0_8_ = uVar38;
  auVar178._10_2_ = uVar83;
  auVar177._10_6_ = auVar178._10_6_;
  auVar177._8_2_ = uVar83;
  auVar177._0_8_ = uVar38;
  uVar83 = (undefined2)uVar18;
  auVar27._4_8_ = auVar177._8_8_;
  auVar27._2_2_ = uVar83;
  auVar27._0_2_ = uVar83;
  fVar252 = (float)((int)sVar47 >> 8);
  fVar256 = (float)(auVar27._0_4_ >> 0x18);
  fVar257 = (float)(auVar177._8_4_ >> 0x18);
  fVar238 = fVar86 * fVar104 + fVar102 * fVar125 + fVar103 * fVar140;
  fVar246 = fVar86 * fVar115 + fVar102 * fVar138 + fVar103 * fVar154;
  fVar248 = fVar86 * fVar116 + fVar102 * fVar139 + fVar103 * fVar155;
  fVar250 = fVar86 * (float)(auVar210._12_4_ >> 0x18) +
            fVar102 * (float)(auVar212._12_4_ >> 0x18) + fVar103 * (float)(auVar51._12_4_ >> 0x18);
  fVar229 = fVar86 * fVar48 + fVar102 * fVar156 + fVar103 * fVar208;
  fVar235 = fVar86 * fVar84 + fVar102 * fVar165 + fVar103 * fVar219;
  fVar236 = fVar86 * fVar85 + fVar102 * fVar166 + fVar103 * fVar220;
  fVar237 = fVar86 * (float)(auVar54._12_4_ >> 0x18) +
            fVar102 * (float)(auVar159._12_4_ >> 0x18) + fVar103 * (float)(auVar169._12_4_ >> 0x18);
  fVar167 = fVar86 * fVar194 + fVar102 * fVar221 + fVar103 * fVar252;
  fVar192 = fVar86 * fVar206 + fVar102 * fVar226 + fVar103 * fVar256;
  fVar193 = fVar86 * fVar207 + fVar102 * fVar227 + fVar103 * fVar257;
  fVar86 = fVar86 * (float)(auVar172._12_4_ >> 0x18) +
           fVar102 * (float)(auVar175._12_4_ >> 0x18) + fVar103 * (float)(auVar178._12_4_ >> 0x18);
  fVar105 = fVar104 * fVar118 + fVar125 * fVar123 + fVar140 * fVar124;
  fVar154 = fVar115 * fVar118 + fVar138 * fVar123 + fVar154 * fVar124;
  fVar155 = fVar116 * fVar118 + fVar139 * fVar123 + fVar155 * fVar124;
  fVar117 = (float)(auVar210._12_4_ >> 0x18) * fVar118 +
            (float)(auVar212._12_4_ >> 0x18) * fVar123 + (float)(auVar51._12_4_ >> 0x18) * fVar124;
  fVar156 = fVar48 * fVar118 + fVar156 * fVar123 + fVar208 * fVar124;
  fVar165 = fVar84 * fVar118 + fVar165 * fVar123 + fVar219 * fVar124;
  fVar166 = fVar85 * fVar118 + fVar166 * fVar123 + fVar220 * fVar124;
  fVar208 = (float)(auVar54._12_4_ >> 0x18) * fVar118 +
            (float)(auVar159._12_4_ >> 0x18) * fVar123 + (float)(auVar169._12_4_ >> 0x18) * fVar124;
  fVar125 = fVar118 * fVar194 + fVar123 * fVar221 + fVar124 * fVar252;
  fVar138 = fVar118 * fVar206 + fVar123 * fVar226 + fVar124 * fVar256;
  fVar139 = fVar118 * fVar207 + fVar123 * fVar227 + fVar124 * fVar257;
  fVar140 = fVar118 * (float)(auVar172._12_4_ >> 0x18) +
            fVar123 * (float)(auVar175._12_4_ >> 0x18) + fVar124 * (float)(auVar178._12_4_ >> 0x18);
  fVar103 = (float)DAT_01f80d30;
  fVar48 = DAT_01f80d30._4_4_;
  fVar84 = DAT_01f80d30._8_4_;
  fVar85 = DAT_01f80d30._12_4_;
  uVar41 = -(uint)(fVar103 <= ABS(fVar238));
  uVar43 = -(uint)(fVar48 <= ABS(fVar246));
  uVar45 = -(uint)(fVar84 <= ABS(fVar248));
  uVar46 = -(uint)(fVar85 <= ABS(fVar250));
  auVar241._0_4_ = (uint)fVar238 & uVar41;
  auVar241._4_4_ = (uint)fVar246 & uVar43;
  auVar241._8_4_ = (uint)fVar248 & uVar45;
  auVar241._12_4_ = (uint)fVar250 & uVar46;
  auVar119._0_4_ = ~uVar41 & (uint)fVar103;
  auVar119._4_4_ = ~uVar43 & (uint)fVar48;
  auVar119._8_4_ = ~uVar45 & (uint)fVar84;
  auVar119._12_4_ = ~uVar46 & (uint)fVar85;
  auVar119 = auVar119 | auVar241;
  uVar41 = -(uint)(fVar103 <= ABS(fVar229));
  uVar43 = -(uint)(fVar48 <= ABS(fVar235));
  uVar45 = -(uint)(fVar84 <= ABS(fVar236));
  uVar46 = -(uint)(fVar85 <= ABS(fVar237));
  auVar230._0_4_ = (uint)fVar229 & uVar41;
  auVar230._4_4_ = (uint)fVar235 & uVar43;
  auVar230._8_4_ = (uint)fVar236 & uVar45;
  auVar230._12_4_ = (uint)fVar237 & uVar46;
  auVar126._0_4_ = ~uVar41 & (uint)fVar103;
  auVar126._4_4_ = ~uVar43 & (uint)fVar48;
  auVar126._8_4_ = ~uVar45 & (uint)fVar84;
  auVar126._12_4_ = ~uVar46 & (uint)fVar85;
  auVar126 = auVar126 | auVar230;
  uVar41 = -(uint)(fVar103 <= ABS(fVar167));
  uVar43 = -(uint)(fVar48 <= ABS(fVar192));
  uVar45 = -(uint)(fVar84 <= ABS(fVar193));
  uVar46 = -(uint)(fVar85 <= ABS(fVar86));
  auVar180._0_4_ = (uint)fVar167 & uVar41;
  auVar180._4_4_ = (uint)fVar192 & uVar43;
  auVar180._8_4_ = (uint)fVar193 & uVar45;
  auVar180._12_4_ = (uint)fVar86 & uVar46;
  auVar161._0_4_ = ~uVar41 & (uint)fVar103;
  auVar161._4_4_ = ~uVar43 & (uint)fVar48;
  auVar161._8_4_ = ~uVar45 & (uint)fVar84;
  auVar161._12_4_ = ~uVar46 & (uint)fVar85;
  auVar161 = auVar161 | auVar180;
  auVar56 = rcpps(_DAT_01f80d30,auVar119);
  fVar103 = auVar56._0_4_;
  fVar85 = auVar56._4_4_;
  fVar104 = auVar56._8_4_;
  fVar118 = auVar56._12_4_;
  fVar103 = (1.0 - auVar119._0_4_ * fVar103) * fVar103 + fVar103;
  fVar85 = (1.0 - auVar119._4_4_ * fVar85) * fVar85 + fVar85;
  fVar104 = (1.0 - auVar119._8_4_ * fVar104) * fVar104 + fVar104;
  fVar118 = (1.0 - auVar119._12_4_ * fVar118) * fVar118 + fVar118;
  auVar56 = rcpps(auVar56,auVar126);
  fVar48 = auVar56._0_4_;
  fVar86 = auVar56._4_4_;
  fVar115 = auVar56._8_4_;
  fVar123 = auVar56._12_4_;
  fVar48 = (1.0 - auVar126._0_4_ * fVar48) * fVar48 + fVar48;
  fVar86 = (1.0 - auVar126._4_4_ * fVar86) * fVar86 + fVar86;
  fVar115 = (1.0 - auVar126._8_4_ * fVar115) * fVar115 + fVar115;
  fVar123 = (1.0 - auVar126._12_4_ * fVar123) * fVar123 + fVar123;
  auVar56 = rcpps(auVar56,auVar161);
  fVar84 = auVar56._0_4_;
  fVar102 = auVar56._4_4_;
  fVar116 = auVar56._8_4_;
  fVar124 = auVar56._12_4_;
  fVar84 = (1.0 - auVar161._0_4_ * fVar84) * fVar84 + fVar84;
  fVar102 = (1.0 - auVar161._4_4_ * fVar102) * fVar102 + fVar102;
  fVar116 = (1.0 - auVar161._8_4_ * fVar116) * fVar116 + fVar116;
  fVar124 = (1.0 - auVar161._12_4_ * fVar124) * fVar124 + fVar124;
  uVar38 = *(ulong *)(prim + uVar39 * 7 + 6);
  uVar83 = (undefined2)(uVar38 >> 0x30);
  auVar59._8_4_ = 0;
  auVar59._0_8_ = uVar38;
  auVar59._12_2_ = uVar83;
  auVar59._14_2_ = uVar83;
  uVar83 = (undefined2)(uVar38 >> 0x20);
  auVar58._12_4_ = auVar59._12_4_;
  auVar58._8_2_ = 0;
  auVar58._0_8_ = uVar38;
  auVar58._10_2_ = uVar83;
  auVar57._10_6_ = auVar58._10_6_;
  auVar57._8_2_ = uVar83;
  auVar57._0_8_ = uVar38;
  uVar83 = (undefined2)(uVar38 >> 0x10);
  auVar28._4_8_ = auVar57._8_8_;
  auVar28._2_2_ = uVar83;
  auVar28._0_2_ = uVar83;
  auVar120._0_8_ =
       CONCAT44(((float)(auVar28._0_4_ >> 0x10) - fVar154) * fVar85,
                ((float)(int)(short)uVar38 - fVar105) * fVar103);
  auVar120._8_4_ = ((float)(auVar57._8_4_ >> 0x10) - fVar155) * fVar104;
  auVar120._12_4_ = ((float)(auVar58._12_4_ >> 0x10) - fVar117) * fVar118;
  uVar38 = *(ulong *)(prim + uVar39 * 9 + 6);
  uVar83 = (undefined2)(uVar38 >> 0x30);
  auVar62._8_4_ = 0;
  auVar62._0_8_ = uVar38;
  auVar62._12_2_ = uVar83;
  auVar62._14_2_ = uVar83;
  uVar83 = (undefined2)(uVar38 >> 0x20);
  auVar61._12_4_ = auVar62._12_4_;
  auVar61._8_2_ = 0;
  auVar61._0_8_ = uVar38;
  auVar61._10_2_ = uVar83;
  auVar60._10_6_ = auVar61._10_6_;
  auVar60._8_2_ = uVar83;
  auVar60._0_8_ = uVar38;
  uVar83 = (undefined2)(uVar38 >> 0x10);
  auVar29._4_8_ = auVar60._8_8_;
  auVar29._2_2_ = uVar83;
  auVar29._0_2_ = uVar83;
  auVar162._0_4_ = ((float)(int)(short)uVar38 - fVar105) * fVar103;
  auVar162._4_4_ = ((float)(auVar29._0_4_ >> 0x10) - fVar154) * fVar85;
  auVar162._8_4_ = ((float)(auVar60._8_4_ >> 0x10) - fVar155) * fVar104;
  auVar162._12_4_ = ((float)(auVar61._12_4_ >> 0x10) - fVar117) * fVar118;
  lVar36 = uVar37 + uVar39;
  uVar38 = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  uVar37 = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar39 * -2 + 6);
  uVar83 = (undefined2)(uVar37 >> 0x30);
  auVar183._8_4_ = 0;
  auVar183._0_8_ = uVar37;
  auVar183._12_2_ = uVar83;
  auVar183._14_2_ = uVar83;
  uVar83 = (undefined2)(uVar37 >> 0x20);
  auVar182._12_4_ = auVar183._12_4_;
  auVar182._8_2_ = 0;
  auVar182._0_8_ = uVar37;
  auVar182._10_2_ = uVar83;
  auVar181._10_6_ = auVar182._10_6_;
  auVar181._8_2_ = uVar83;
  auVar181._0_8_ = uVar37;
  uVar83 = (undefined2)(uVar37 >> 0x10);
  auVar30._4_8_ = auVar181._8_8_;
  auVar30._2_2_ = uVar83;
  auVar30._0_2_ = uVar83;
  auVar184._0_8_ =
       CONCAT44(((float)(auVar30._0_4_ >> 0x10) - fVar165) * fVar86,
                ((float)(int)(short)uVar37 - fVar156) * fVar48);
  auVar184._8_4_ = ((float)(auVar181._8_4_ >> 0x10) - fVar166) * fVar115;
  auVar184._12_4_ = ((float)(auVar182._12_4_ >> 0x10) - fVar208) * fVar123;
  uVar83 = (undefined2)(uVar38 >> 0x30);
  auVar65._8_4_ = 0;
  auVar65._0_8_ = uVar38;
  auVar65._12_2_ = uVar83;
  auVar65._14_2_ = uVar83;
  uVar83 = (undefined2)(uVar38 >> 0x20);
  auVar64._12_4_ = auVar65._12_4_;
  auVar64._8_2_ = 0;
  auVar64._0_8_ = uVar38;
  auVar64._10_2_ = uVar83;
  auVar63._10_6_ = auVar64._10_6_;
  auVar63._8_2_ = uVar83;
  auVar63._0_8_ = uVar38;
  uVar83 = (undefined2)(uVar38 >> 0x10);
  auVar31._4_8_ = auVar63._8_8_;
  auVar31._2_2_ = uVar83;
  auVar31._0_2_ = uVar83;
  auVar66._0_4_ = ((float)(int)(short)uVar38 - fVar156) * fVar48;
  auVar66._4_4_ = ((float)(auVar31._0_4_ >> 0x10) - fVar165) * fVar86;
  auVar66._8_4_ = ((float)(auVar63._8_4_ >> 0x10) - fVar166) * fVar115;
  auVar66._12_4_ = ((float)(auVar64._12_4_ >> 0x10) - fVar208) * fVar123;
  uVar38 = *(ulong *)(prim + lVar36 + 6);
  uVar83 = (undefined2)(uVar38 >> 0x30);
  auVar143._8_4_ = 0;
  auVar143._0_8_ = uVar38;
  auVar143._12_2_ = uVar83;
  auVar143._14_2_ = uVar83;
  uVar83 = (undefined2)(uVar38 >> 0x20);
  auVar142._12_4_ = auVar143._12_4_;
  auVar142._8_2_ = 0;
  auVar142._0_8_ = uVar38;
  auVar142._10_2_ = uVar83;
  auVar141._10_6_ = auVar142._10_6_;
  auVar141._8_2_ = uVar83;
  auVar141._0_8_ = uVar38;
  uVar83 = (undefined2)(uVar38 >> 0x10);
  auVar32._4_8_ = auVar141._8_8_;
  auVar32._2_2_ = uVar83;
  auVar32._0_2_ = uVar83;
  auVar144._0_8_ =
       CONCAT44(((float)(auVar32._0_4_ >> 0x10) - fVar138) * fVar102,
                ((float)(int)(short)uVar38 - fVar125) * fVar84);
  auVar144._8_4_ = ((float)(auVar141._8_4_ >> 0x10) - fVar139) * fVar116;
  auVar144._12_4_ = ((float)(auVar142._12_4_ >> 0x10) - fVar140) * fVar124;
  uVar38 = *(ulong *)(prim + uVar39 * 0x17 + 6);
  uVar83 = (undefined2)(uVar38 >> 0x30);
  auVar197._8_4_ = 0;
  auVar197._0_8_ = uVar38;
  auVar197._12_2_ = uVar83;
  auVar197._14_2_ = uVar83;
  uVar83 = (undefined2)(uVar38 >> 0x20);
  auVar196._12_4_ = auVar197._12_4_;
  auVar196._8_2_ = 0;
  auVar196._0_8_ = uVar38;
  auVar196._10_2_ = uVar83;
  auVar195._10_6_ = auVar196._10_6_;
  auVar195._8_2_ = uVar83;
  auVar195._0_8_ = uVar38;
  uVar83 = (undefined2)(uVar38 >> 0x10);
  auVar33._4_8_ = auVar195._8_8_;
  auVar33._2_2_ = uVar83;
  auVar33._0_2_ = uVar83;
  auVar198._0_4_ = ((float)(int)(short)uVar38 - fVar125) * fVar84;
  auVar198._4_4_ = ((float)(auVar33._0_4_ >> 0x10) - fVar138) * fVar102;
  auVar198._8_4_ = ((float)(auVar195._8_4_ >> 0x10) - fVar139) * fVar116;
  auVar198._12_4_ = ((float)(auVar196._12_4_ >> 0x10) - fVar140) * fVar124;
  auVar209._8_4_ = auVar120._8_4_;
  auVar209._0_8_ = auVar120._0_8_;
  auVar209._12_4_ = auVar120._12_4_;
  auVar210 = minps(auVar209,auVar162);
  auVar87._8_4_ = auVar184._8_4_;
  auVar87._0_8_ = auVar184._0_8_;
  auVar87._12_4_ = auVar184._12_4_;
  auVar56 = minps(auVar87,auVar66);
  auVar210 = maxps(auVar210,auVar56);
  auVar88._8_4_ = auVar144._8_4_;
  auVar88._0_8_ = auVar144._0_8_;
  auVar88._12_4_ = auVar144._12_4_;
  auVar56 = minps(auVar88,auVar198);
  uVar4 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar127._4_4_ = uVar4;
  auVar127._0_4_ = uVar4;
  auVar127._8_4_ = uVar4;
  auVar127._12_4_ = uVar4;
  auVar56 = maxps(auVar56,auVar127);
  auVar56 = maxps(auVar210,auVar56);
  local_1a8 = auVar56._0_4_ * 0.99999964;
  fStack_1a4 = auVar56._4_4_ * 0.99999964;
  fStack_1a0 = auVar56._8_4_ * 0.99999964;
  fStack_19c = auVar56._12_4_ * 0.99999964;
  auVar56 = maxps(auVar120,auVar162);
  auVar210 = maxps(auVar184,auVar66);
  auVar56 = minps(auVar56,auVar210);
  auVar210 = maxps(auVar144,auVar198);
  fVar103 = (ray->super_RayK<1>).tfar;
  auVar67._4_4_ = fVar103;
  auVar67._0_4_ = fVar103;
  auVar67._8_4_ = fVar103;
  auVar67._12_4_ = fVar103;
  auVar210 = minps(auVar210,auVar67);
  auVar56 = minps(auVar56,auVar210);
  auVar89._0_4_ = -(uint)(PVar3 != (Primitive)0x0 && local_1a8 <= auVar56._0_4_ * 1.0000004);
  auVar89._4_4_ = -(uint)(1 < (byte)PVar3 && fStack_1a4 <= auVar56._4_4_ * 1.0000004);
  auVar89._8_4_ = -(uint)(2 < (byte)PVar3 && fStack_1a0 <= auVar56._8_4_ * 1.0000004);
  auVar89._12_4_ = -(uint)(3 < (byte)PVar3 && fStack_19c <= auVar56._12_4_ * 1.0000004);
  uVar41 = movmskps((int)lVar36,auVar89);
  if (uVar41 == 0) {
    return;
  }
  uVar41 = uVar41 & 0xff;
  local_158._0_4_ = -(uint)((int)mm_lookupmask_ps._240_4_ < 0);
  local_158._4_4_ = -(uint)((int)mm_lookupmask_ps._244_4_ < 0);
  local_158._8_4_ = -(uint)((int)mm_lookupmask_ps._248_4_ < 0);
  local_158._12_4_ = 0;
  local_2a0 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)ray;
LAB_00a8cce6:
  paVar34 = local_2a0;
  uVar38 = (ulong)uVar41;
  lVar36 = 0;
  if (uVar38 != 0) {
    for (; (uVar41 >> lVar36 & 1) == 0; lVar36 = lVar36 + 1) {
    }
  }
  fVar103 = *(float *)(prim + 2);
  pGVar5 = (context->scene->geometries).items[(uint)fVar103].ptr;
  local_3c0 = (ulong)*(uint *)(prim + lVar36 * 4 + 6);
  uVar39 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar36 * 4 + 6));
  p_Var6 = pGVar5[1].intersectionFilterN;
  pvVar7 = pGVar5[2].userPtr;
  _Var8 = pGVar5[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar2 = (float *)(_Var8 + uVar39 * (long)pvVar7);
  fVar48 = *pfVar2;
  fVar84 = pfVar2[1];
  fVar85 = pfVar2[2];
  fVar86 = pfVar2[3];
  pfVar2 = (float *)(_Var8 + (uVar39 + 1) * (long)pvVar7);
  fVar102 = *pfVar2;
  fVar104 = pfVar2[1];
  fVar115 = pfVar2[2];
  fVar116 = pfVar2[3];
  pfVar2 = (float *)(_Var8 + (uVar39 + 2) * (long)pvVar7);
  fVar118 = *pfVar2;
  fVar123 = pfVar2[1];
  fVar124 = pfVar2[2];
  fVar125 = pfVar2[3];
  pfVar2 = (float *)(_Var8 + (long)pvVar7 * (uVar39 + 3));
  fVar138 = *pfVar2;
  fVar139 = pfVar2[1];
  fVar140 = pfVar2[2];
  fVar105 = pfVar2[3];
  uVar38 = uVar38 - 1 & uVar38;
  uVar37 = *(ulong *)&pGVar5[1].time_range.upper;
  pfVar2 = (float *)(uVar37 + (long)p_Var6 * uVar39);
  fVar154 = *pfVar2;
  fVar155 = pfVar2[1];
  fVar117 = pfVar2[2];
  fVar156 = pfVar2[3];
  pfVar2 = (float *)(uVar37 + (long)p_Var6 * (uVar39 + 1));
  fVar165 = *pfVar2;
  fVar166 = pfVar2[1];
  fVar167 = pfVar2[2];
  fVar192 = pfVar2[3];
  pfVar2 = (float *)(uVar37 + (long)p_Var6 * (uVar39 + 2));
  fVar193 = *pfVar2;
  fVar194 = pfVar2[1];
  fVar206 = pfVar2[2];
  fVar207 = pfVar2[3];
  lVar36 = 0;
  if (uVar38 != 0) {
    for (; (uVar38 >> lVar36 & 1) == 0; lVar36 = lVar36 + 1) {
    }
  }
  pfVar2 = (float *)(uVar37 + (long)p_Var6 * (uVar39 + 3));
  fVar208 = *pfVar2;
  fVar219 = pfVar2[1];
  fVar220 = pfVar2[2];
  fVar221 = pfVar2[3];
  if (((uVar38 != 0) && (uVar39 = uVar38 - 1 & uVar38, uVar39 != 0)) && (lVar36 = 0, uVar39 != 0)) {
    for (; (uVar39 >> lVar36 & 1) == 0; lVar36 = lVar36 + 1) {
    }
  }
  fVar226 = fVar193 * 0.0 + fVar208 * -0.0 + fVar165 + fVar154 * -0.0;
  fVar227 = fVar194 * 0.0 + fVar219 * -0.0 + fVar166 + fVar155 * -0.0;
  fVar229 = fVar206 * 0.0 + fVar220 * -0.0 + fVar167 + fVar117 * -0.0;
  fVar235 = fVar207 * 0.0 + fVar221 * -0.0 + fVar192 + fVar156 * -0.0;
  fVar236 = (fVar193 * 0.5 + fVar208 * 0.0 + fVar165 * 0.0) - fVar154 * 0.5;
  fVar237 = (fVar194 * 0.5 + fVar219 * 0.0 + fVar166 * 0.0) - fVar155 * 0.5;
  fVar238 = (fVar206 * 0.5 + fVar220 * 0.0 + fVar167 * 0.0) - fVar117 * 0.5;
  fVar246 = (fVar207 * 0.5 + fVar221 * 0.0 + fVar192 * 0.0) - fVar156 * 0.5;
  fVar239 = (fVar118 * 0.5 + fVar138 * 0.0 + fVar102 * 0.0) - fVar48 * 0.5;
  fVar247 = (fVar123 * 0.5 + fVar139 * 0.0 + fVar104 * 0.0) - fVar84 * 0.5;
  fVar249 = (fVar124 * 0.5 + fVar140 * 0.0 + fVar115 * 0.0) - fVar85 * 0.5;
  fVar251 = (fVar125 * 0.5 + fVar105 * 0.0 + fVar116 * 0.0) - fVar86 * 0.5;
  fVar252 = fVar118 * 0.0 + fVar138 * -0.0 + fVar102 + fVar48 * -0.0;
  fVar256 = fVar123 * 0.0 + fVar139 * -0.0 + fVar104 + fVar84 * -0.0;
  fVar257 = fVar124 * 0.0 + fVar140 * -0.0 + fVar115 + fVar85 * -0.0;
  fVar228 = fVar125 * 0.0 + fVar105 * -0.0 + fVar116 + fVar86 * -0.0;
  fVar248 = fVar208 * -0.0 + fVar193 + fVar165 * 0.0 + fVar154 * -0.0;
  fVar250 = fVar219 * -0.0 + fVar194 + fVar166 * 0.0 + fVar155 * -0.0;
  local_3ec.m128[3] = fVar220 * -0.0 + fVar206 + fVar167 * 0.0 + fVar117 * -0.0;
  fStack_3dc = fVar221 * -0.0 + fVar207 + fVar192 * 0.0 + fVar156 * -0.0;
  fVar154 = fVar154 * 0.0 + ((fVar208 * 0.5 + fVar193 * 0.0) - fVar165 * 0.5);
  fVar155 = fVar155 * 0.0 + ((fVar219 * 0.5 + fVar194 * 0.0) - fVar166 * 0.5);
  fVar117 = fVar117 * 0.0 + ((fVar220 * 0.5 + fVar206 * 0.0) - fVar167 * 0.5);
  fVar156 = fVar156 * 0.0 + ((fVar221 * 0.5 + fVar207 * 0.0) - fVar192 * 0.5);
  fVar165 = fVar138 * -0.0 + fVar118 + fVar102 * 0.0 + fVar48 * -0.0;
  fVar166 = fVar139 * -0.0 + fVar123 + fVar104 * 0.0 + fVar84 * -0.0;
  fVar167 = fVar140 * -0.0 + fVar124 + fVar115 * 0.0 + fVar85 * -0.0;
  fVar192 = fVar105 * -0.0 + fVar125 + fVar116 * 0.0 + fVar86 * -0.0;
  fVar48 = fVar48 * 0.0 + ((fVar138 * 0.5 + fVar118 * 0.0) - fVar102 * 0.5);
  fVar84 = fVar84 * 0.0 + ((fVar139 * 0.5 + fVar123 * 0.0) - fVar104 * 0.5);
  fVar85 = fVar85 * 0.0 + ((fVar140 * 0.5 + fVar124 * 0.0) - fVar115 * 0.5);
  fVar86 = fVar86 * 0.0 + ((fVar105 * 0.5 + fVar125 * 0.0) - fVar116 * 0.5);
  fVar194 = fVar237 * fVar252 - fVar256 * fVar236;
  fVar207 = fVar238 * fVar256 - fVar257 * fVar237;
  fVar208 = fVar236 * fVar257 - fVar252 * fVar238;
  fVar219 = fVar246 * fVar228 - fVar228 * fVar246;
  fVar138 = fVar237 * fVar239 - fVar247 * fVar236;
  fVar140 = fVar238 * fVar247 - fVar249 * fVar237;
  fVar105 = fVar236 * fVar249 - fVar239 * fVar238;
  fVar116 = fVar155 * fVar165 - fVar166 * fVar154;
  fVar123 = fVar117 * fVar166 - fVar167 * fVar155;
  fVar124 = fVar154 * fVar167 - fVar165 * fVar117;
  fVar125 = fVar156 * fVar192 - fVar192 * fVar156;
  fVar102 = fVar155 * fVar48 - fVar84 * fVar154;
  fVar84 = fVar117 * fVar84 - fVar85 * fVar155;
  fVar85 = fVar154 * fVar85 - fVar48 * fVar117;
  fVar167 = fVar208 * fVar208 + fVar207 * fVar207 + fVar194 * fVar194;
  auVar210 = ZEXT416((uint)fVar167);
  auVar56 = rsqrtss(ZEXT416((uint)fVar167),auVar210);
  fVar48 = auVar56._0_4_;
  fVar192 = fVar48 * 1.5 - fVar48 * fVar48 * fVar167 * 0.5 * fVar48;
  fVar206 = fVar194 * fVar138 + fVar208 * fVar105 + fVar207 * fVar140;
  fVar48 = fVar219 * fVar192;
  auVar56 = rcpss(auVar210,auVar210);
  fVar139 = (2.0 - fVar167 * auVar56._0_4_) * auVar56._0_4_;
  fVar165 = fVar124 * fVar124 + fVar123 * fVar123 + fVar116 * fVar116;
  auVar56 = ZEXT416((uint)fVar165);
  auVar210 = rsqrtss(ZEXT416((uint)fVar165),auVar56);
  fVar104 = auVar210._0_4_;
  fVar118 = fVar104 * 1.5 - fVar104 * fVar104 * fVar165 * 0.5 * fVar104;
  fVar193 = fVar116 * fVar102 + fVar124 * fVar85 + fVar123 * fVar84;
  fVar115 = fVar125 * fVar118;
  auVar56 = rcpss(auVar56,auVar56);
  fVar104 = (2.0 - fVar165 * auVar56._0_4_) * auVar56._0_4_;
  local_328 = fVar235 * fVar207 * fVar192;
  fStack_324 = fVar235 * fVar208 * fVar192;
  fStack_320 = fVar235 * fVar194 * fVar192;
  fStack_31c = fVar235 * fVar48;
  local_338 = fVar226 - local_328;
  fStack_334 = fVar227 - fStack_324;
  fStack_330 = fVar229 - fStack_320;
  fStack_32c = fVar235 - fStack_31c;
  fVar140 = fVar235 * fVar139 * (fVar167 * fVar140 - fVar206 * fVar207) * fVar192 +
            fVar246 * fVar207 * fVar192;
  fVar105 = fVar235 * fVar139 * (fVar167 * fVar105 - fVar206 * fVar208) * fVar192 +
            fVar246 * fVar208 * fVar192;
  fVar166 = fVar235 * fVar139 * (fVar167 * fVar138 - fVar206 * fVar194) * fVar192 +
            fVar246 * fVar194 * fVar192;
  fVar139 = fVar235 * fVar139 * (fVar167 * (fVar246 * fVar251 - fVar251 * fVar246) -
                                fVar206 * fVar219) * fVar192 + fVar246 * fVar48;
  local_328 = local_328 + fVar226;
  fStack_324 = fStack_324 + fVar227;
  fStack_320 = fStack_320 + fVar229;
  fStack_31c = fStack_31c + fVar235;
  local_3b8 = fStack_3dc * fVar123 * fVar118;
  fStack_3b4 = fStack_3dc * fVar124 * fVar118;
  fStack_3b0 = fStack_3dc * fVar116 * fVar118;
  fStack_3ac = fStack_3dc * fVar115;
  local_358 = fVar248 - local_3b8;
  fStack_354 = fVar250 - fStack_3b4;
  fStack_350 = local_3ec.m128[3] - fStack_3b0;
  fStack_34c = fStack_3dc - fStack_3ac;
  fVar48 = fStack_3dc * fVar104 * (fVar165 * fVar84 - fVar193 * fVar123) * fVar118 +
           fVar156 * fVar123 * fVar118;
  fVar84 = fStack_3dc * fVar104 * (fVar165 * fVar85 - fVar193 * fVar124) * fVar118 +
           fVar156 * fVar124 * fVar118;
  fVar85 = fStack_3dc * fVar104 * (fVar165 * fVar102 - fVar193 * fVar116) * fVar118 +
           fVar156 * fVar116 * fVar118;
  fVar86 = fStack_3dc *
           fVar104 * (fVar165 * (fVar156 * fVar86 - fVar86 * fVar156) - fVar193 * fVar125) * fVar118
           + fVar156 * fVar115;
  local_3b8 = local_3b8 + fVar248;
  fStack_3b4 = fStack_3b4 + fVar250;
  fStack_3b0 = fStack_3b0 + local_3ec.m128[3];
  fStack_3ac = fStack_3ac + fStack_3dc;
  local_348 = (fVar236 - fVar140) * 0.33333334 + local_338;
  fStack_344 = (fVar237 - fVar105) * 0.33333334 + fStack_334;
  fStack_340 = (fVar238 - fVar166) * 0.33333334 + fStack_330;
  fStack_33c = (fVar246 - fVar139) * 0.33333334 + fStack_32c;
  local_368 = local_358 - (fVar154 - fVar48) * 0.33333334;
  fStack_364 = fStack_354 - (fVar155 - fVar84) * 0.33333334;
  fStack_360 = fStack_350 - (fVar117 - fVar85) * 0.33333334;
  fStack_35c = fStack_34c - (fVar156 - fVar86) * 0.33333334;
  local_378 = local_3b8 - (fVar48 + fVar154) * 0.33333334;
  fStack_374 = fStack_3b4 - (fVar84 + fVar155) * 0.33333334;
  fStack_370 = fStack_3b0 - (fVar85 + fVar117) * 0.33333334;
  fStack_36c = fStack_3ac - (fVar86 + fVar156) * 0.33333334;
  fVar48 = (local_2a0->field_1).x;
  fVar84 = (local_2a0->field_1).y;
  fVar85 = (local_2a0->field_1).z;
  fVar86 = (pre->ray_space).vx.field_0.m128[0];
  fVar102 = (pre->ray_space).vx.field_0.m128[1];
  fVar104 = (pre->ray_space).vy.field_0.m128[0];
  fVar115 = (pre->ray_space).vy.field_0.m128[1];
  fVar116 = (pre->ray_space).vz.field_0.m128[0];
  fVar118 = (pre->ray_space).vz.field_0.m128[1];
  fVar117 = (local_338 - fVar48) * fVar86 +
            (fStack_334 - fVar84) * fVar104 + (fStack_330 - fVar85) * fVar116;
  fVar156 = (local_338 - fVar48) * fVar102 +
            (fStack_334 - fVar84) * fVar115 + (fStack_330 - fVar85) * fVar118;
  local_2b8 = CONCAT44(fVar156,fVar117);
  fVar154 = (local_348 - fVar48) * fVar86 +
            (fStack_344 - fVar84) * fVar104 + (fStack_340 - fVar85) * fVar116;
  fVar155 = (local_348 - fVar48) * fVar102 +
            (fStack_344 - fVar84) * fVar115 + (fStack_340 - fVar85) * fVar118;
  uVar240 = CONCAT44(fVar155,fVar154);
  fVar125 = (local_368 - fVar48) * fVar86 +
            (fStack_364 - fVar84) * fVar104 + (fStack_360 - fVar85) * fVar116;
  fVar138 = (local_368 - fVar48) * fVar102 +
            (fStack_364 - fVar84) * fVar115 + (fStack_360 - fVar85) * fVar118;
  auVar90._0_8_ = CONCAT44(fVar138,fVar125);
  fVar123 = (local_358 - fVar48) * fVar86 +
            (fStack_354 - fVar84) * fVar104 + (fStack_350 - fVar85) * fVar116;
  fVar124 = (local_358 - fVar48) * fVar102 +
            (fStack_354 - fVar84) * fVar115 + (fStack_350 - fVar85) * fVar118;
  local_3a8 = CONCAT44(fVar124,fVar123);
  local_2e8 = (local_328 - fVar48) * fVar86 +
              (fStack_324 - fVar84) * fVar104 + (fStack_320 - fVar85) * fVar116;
  fStack_2e4 = (local_328 - fVar48) * fVar102 +
               (fStack_324 - fVar84) * fVar115 + (fStack_320 - fVar85) * fVar118;
  local_208 = (fVar140 + fVar236) * 0.33333334 + local_328;
  fStack_204 = (fVar105 + fVar237) * 0.33333334 + fStack_324;
  fStack_200 = (fVar166 + fVar238) * 0.33333334 + fStack_320;
  fStack_1fc = (fVar139 + fVar246) * 0.33333334 + fStack_31c;
  fVar139 = (local_208 - fVar48) * fVar86 +
            (fStack_204 - fVar84) * fVar104 + (fStack_200 - fVar85) * fVar116;
  fVar140 = (local_208 - fVar48) * fVar102 +
            (fStack_204 - fVar84) * fVar115 + (fStack_200 - fVar85) * fVar118;
  uVar157 = CONCAT44(fVar140,fVar139);
  afStack_1e8[0] =
       (local_378 - fVar48) * fVar86 +
       (fStack_374 - fVar84) * fVar104 + (fStack_370 - fVar85) * fVar116;
  afStack_1e8[1] =
       (local_378 - fVar48) * fVar102 +
       (fStack_374 - fVar84) * fVar115 + (fStack_370 - fVar85) * fVar118;
  fVar86 = (local_3b8 - fVar48) * fVar86 +
           (fStack_3b4 - fVar84) * fVar104 + (fStack_3b0 - fVar85) * fVar116;
  fVar48 = (local_3b8 - fVar48) * fVar102 +
           (fStack_3b4 - fVar84) * fVar115 + (fStack_3b0 - fVar85) * fVar118;
  local_318 = CONCAT44(fVar48,fVar86);
  register0x000014c8 = uVar157;
  local_388 = uVar240;
  register0x00001588 = local_318;
  local_88 = local_3a8;
  auVar68._8_4_ = local_2e8;
  auVar68._0_8_ = local_2b8;
  auVar68._12_4_ = fStack_2e4;
  auVar56 = minps(auVar68,_local_388);
  auVar90._8_4_ = afStack_1e8[0];
  auVar90._12_4_ = afStack_1e8[1];
  auVar210 = minps(auVar90,_local_88);
  auVar56 = minps(auVar56,auVar210);
  auVar91._4_4_ = fVar156;
  auVar91._0_4_ = fVar117;
  auVar91._8_4_ = local_2e8;
  auVar91._12_4_ = fStack_2e4;
  auVar210 = maxps(auVar91,_local_388);
  auVar106._4_4_ = fVar138;
  auVar106._0_4_ = fVar125;
  auVar106._8_4_ = afStack_1e8[0];
  auVar106._12_4_ = afStack_1e8[1];
  auVar107 = maxps(auVar106,_local_88);
  auVar92 = maxps(auVar210,auVar107);
  auVar10._4_8_ = auVar107._8_8_;
  auVar10._0_4_ = auVar56._4_4_;
  auVar108._0_8_ = auVar10._0_8_ << 0x20;
  auVar108._8_4_ = auVar56._8_4_;
  auVar108._12_4_ = auVar56._12_4_;
  auVar109._8_8_ = auVar56._8_8_;
  auVar109._0_8_ = auVar108._8_8_;
  auVar210 = minps(auVar56,auVar109);
  auVar11._4_8_ = auVar56._8_8_;
  auVar11._0_4_ = auVar92._4_4_;
  auVar110._0_8_ = auVar11._0_8_ << 0x20;
  auVar110._8_4_ = auVar92._8_4_;
  auVar110._12_4_ = auVar92._12_4_;
  auVar111._8_8_ = auVar92._8_8_;
  auVar111._0_8_ = auVar110._8_8_;
  auVar56 = maxps(auVar92,auVar111);
  auVar69._0_8_ = auVar210._0_8_ & 0x7fffffff7fffffff;
  auVar69._8_4_ = auVar210._8_4_ & 0x7fffffff;
  auVar69._12_4_ = auVar210._12_4_ & 0x7fffffff;
  auVar93._0_8_ = auVar56._0_8_ & 0x7fffffff7fffffff;
  auVar93._8_4_ = auVar56._8_4_ & 0x7fffffff;
  auVar93._12_4_ = auVar56._12_4_ & 0x7fffffff;
  auVar56 = maxps(auVar69,auVar93);
  fStack_94 = auVar56._4_4_;
  local_98 = fStack_94;
  if (fStack_94 <= auVar56._0_4_) {
    local_98 = auVar56._0_4_;
  }
  local_98 = local_98 * 9.536743e-07;
  register0x000015c8 = local_2b8;
  register0x00001408 = uVar240;
  local_2c8 = uVar240;
  register0x00001308 = auVar90._0_8_;
  local_2d8 = auVar90._0_8_;
  uStack_3a0 = local_3a8;
  register0x00001288 = uVar157;
  local_2f8 = uVar157;
  register0x00001348 = local_318;
  fStack_90 = fStack_94;
  fStack_8c = fStack_94;
  local_3ec._4_8_ = local_2b8;
  local_a8 = fVar154 - fVar117;
  fStack_a4 = fVar155 - fVar156;
  fStack_a0 = fVar139 - local_2e8;
  fStack_9c = fVar140 - fStack_2e4;
  local_b8 = fVar125 - fVar154;
  fStack_b4 = fVar138 - fVar155;
  fStack_b0 = afStack_1e8[0] - fVar139;
  fStack_ac = afStack_1e8[1] - fVar140;
  local_1f8 = auVar90._0_8_;
  local_c8 = fVar123 - fVar125;
  fStack_c4 = fVar124 - fVar138;
  fStack_c0 = fVar86 - afStack_1e8[0];
  fStack_bc = fVar48 - afStack_1e8[1];
  local_168 = local_328 - local_338;
  fStack_164 = fStack_324 - fStack_334;
  fStack_160 = fStack_320 - fStack_330;
  fStack_15c = fStack_31c - fStack_32c;
  local_178 = local_208 - local_348;
  fStack_174 = fStack_204 - fStack_344;
  fStack_170 = fStack_200 - fStack_340;
  fStack_16c = fStack_1fc - fStack_33c;
  local_188 = local_378 - local_368;
  fStack_184 = fStack_374 - fStack_364;
  fStack_180 = fStack_370 - fStack_360;
  fStack_17c = fStack_36c - fStack_35c;
  local_198 = local_3b8 - local_358;
  fStack_194 = fStack_3b4 - fStack_354;
  fStack_190 = fStack_3b0 - fStack_350;
  fStack_18c = fStack_3ac - fStack_34c;
  uVar39 = 0;
  local_428._4_4_ = 0.0;
  fStack_41c = 1.0;
  local_398 = 0.0;
  fStack_394 = 1.0;
  fStack_390 = 0.0;
  fStack_38c = 0.0;
  local_258 = local_98;
  fStack_254 = local_98;
  fStack_250 = local_98;
  fStack_24c = local_98;
  local_268 = -local_98;
  fStack_264 = -local_98;
  fStack_260 = -local_98;
  fStack_25c = -local_98;
  fStack_2e0 = local_2e8;
  fStack_2dc = fStack_2e4;
  local_308 = afStack_1e8[0];
  fStack_304 = afStack_1e8[1];
  fStack_300 = afStack_1e8[0];
  fStack_2fc = afStack_1e8[1];
  fVar48 = fVar123;
  fVar84 = fVar124;
LAB_00a8d577:
  do {
    fVar85 = 1.0 - (float)local_428._4_4_;
    fVar86 = 1.0 - (float)local_428._4_4_;
    fVar104 = 1.0 - fStack_41c;
    fVar115 = 1.0 - fStack_41c;
    fVar154 = local_2b8._0_4_ * fVar85 + local_2e8 * (float)local_428._4_4_;
    fVar167 = local_2b8._4_4_ * fVar86 + fStack_2e4 * (float)local_428._4_4_;
    fVar192 = local_2b8._8_4_ * fVar104 + fStack_2e0 * fStack_41c;
    fVar193 = local_2b8._12_4_ * fVar115 + fStack_2dc * fStack_41c;
    fVar102 = local_2c8._0_4_ * fVar85 + local_2f8._0_4_ * (float)local_428._4_4_;
    fVar156 = local_2c8._4_4_ * fVar86 + local_2f8._4_4_ * (float)local_428._4_4_;
    fVar165 = local_2c8._8_4_ * fVar104 + local_2f8._8_4_ * fStack_41c;
    fVar166 = local_2c8._12_4_ * fVar115 + local_2f8._12_4_ * fStack_41c;
    fVar207 = local_2d8._0_4_ * fVar85 + local_308 * (float)local_428._4_4_;
    fVar208 = local_2d8._4_4_ * fVar86 + fStack_304 * (float)local_428._4_4_;
    fVar238 = local_2d8._8_4_ * fVar104 + fStack_300 * fStack_41c;
    fVar246 = local_2d8._12_4_ * fVar115 + fStack_2fc * fStack_41c;
    fVar194 = fVar85 * fVar123 + (float)local_428._4_4_ * local_318._0_4_;
    fVar206 = fVar86 * fVar124 + (float)local_428._4_4_ * local_318._4_4_;
    fVar221 = fVar104 * fVar48 + fStack_41c * local_318._8_4_;
    fVar226 = fVar115 * fVar84 + fStack_41c * local_318._12_4_;
    fVar227 = (fStack_394 - local_398) * 0.11111111;
    fVar229 = (fStack_394 - local_398) * 0.0 + local_398;
    fVar235 = (fStack_394 - local_398) * 0.33333334 + local_398;
    fVar236 = (fStack_394 - local_398) * 0.6666667 + local_398;
    fVar237 = (fStack_394 - local_398) * 1.0 + local_398;
    fVar84 = 1.0 - fVar229;
    fVar86 = 1.0 - fVar235;
    fVar104 = 1.0 - fVar236;
    fVar115 = 1.0 - fVar237;
    fVar118 = fVar102 * fVar84 + fVar207 * fVar229;
    fVar123 = fVar102 * fVar86 + fVar207 * fVar235;
    fVar124 = fVar102 * fVar104 + fVar207 * fVar236;
    fVar125 = fVar102 * fVar115 + fVar207 * fVar237;
    fVar138 = fVar156 * fVar84 + fVar208 * fVar229;
    fVar139 = fVar156 * fVar86 + fVar208 * fVar235;
    fVar140 = fVar156 * fVar104 + fVar208 * fVar236;
    fVar105 = fVar156 * fVar115 + fVar208 * fVar237;
    fVar116 = (fVar154 * fVar84 + fVar102 * fVar229) * fVar84 + fVar229 * fVar118;
    fVar48 = (fVar154 * fVar86 + fVar102 * fVar235) * fVar86 + fVar235 * fVar123;
    fVar85 = (fVar154 * fVar104 + fVar102 * fVar236) * fVar104 + fVar236 * fVar124;
    fVar102 = (fVar154 * fVar115 + fVar102 * fVar237) * fVar115 + fVar237 * fVar125;
    fVar154 = (fVar167 * fVar84 + fVar156 * fVar229) * fVar84 + fVar229 * fVar138;
    fVar155 = (fVar167 * fVar86 + fVar156 * fVar235) * fVar86 + fVar235 * fVar139;
    fVar117 = (fVar167 * fVar104 + fVar156 * fVar236) * fVar104 + fVar236 * fVar140;
    fVar156 = (fVar167 * fVar115 + fVar156 * fVar237) * fVar115 + fVar237 * fVar105;
    fVar118 = fVar118 * fVar84 + (fVar207 * fVar84 + fVar194 * fVar229) * fVar229;
    fVar123 = fVar123 * fVar86 + (fVar207 * fVar86 + fVar194 * fVar235) * fVar235;
    fVar124 = fVar124 * fVar104 + (fVar207 * fVar104 + fVar194 * fVar236) * fVar236;
    fVar125 = fVar125 * fVar115 + (fVar207 * fVar115 + fVar194 * fVar237) * fVar237;
    fVar138 = fVar138 * fVar84 + (fVar208 * fVar84 + fVar206 * fVar229) * fVar229;
    fVar139 = fVar139 * fVar86 + (fVar208 * fVar86 + fVar206 * fVar235) * fVar235;
    fVar140 = fVar140 * fVar104 + (fVar208 * fVar104 + fVar206 * fVar236) * fVar236;
    fVar105 = fVar105 * fVar115 + (fVar208 * fVar115 + fVar206 * fVar237) * fVar237;
    local_248 = fVar84 * fVar116 + fVar229 * fVar118;
    fStack_244 = fVar86 * fVar48 + fVar235 * fVar123;
    fStack_240 = fVar104 * fVar85 + fVar236 * fVar124;
    fStack_23c = fVar115 * fVar102 + fVar237 * fVar125;
    local_148 = fVar84 * fVar154 + fVar229 * fVar138;
    fStack_144 = fVar86 * fVar155 + fVar235 * fVar139;
    fStack_140 = fVar104 * fVar117 + fVar236 * fVar140;
    fStack_13c = fVar115 * fVar156 + fVar237 * fVar105;
    fVar123 = (fVar123 - fVar48) * 3.0 * fVar227;
    fVar124 = (fVar124 - fVar85) * 3.0 * fVar227;
    fVar125 = (fVar125 - fVar102) * 3.0 * fVar227;
    fVar48 = (fVar139 - fVar155) * 3.0 * fVar227;
    fVar85 = (fVar140 - fVar117) * 3.0 * fVar227;
    fVar102 = (fVar105 - fVar156) * 3.0 * fVar227;
    local_218._4_4_ = fStack_240;
    local_218._0_4_ = fStack_244;
    local_218._8_4_ = fStack_23c;
    local_218._12_4_ = 0;
    local_e8._4_4_ = fStack_140;
    local_e8._0_4_ = fStack_144;
    local_228 = local_248 + (fVar118 - fVar116) * 3.0 * fVar227;
    fStack_224 = fStack_244 + fVar123;
    fStack_220 = fStack_240 + fVar124;
    fStack_21c = fStack_23c + fVar125;
    local_3d8._0_4_ = local_148 + (fVar138 - fVar154) * 3.0 * fVar227;
    local_3d8._4_4_ = fStack_144 + fVar48;
    fStack_3d0 = fStack_140 + fVar85;
    fStack_3cc = fStack_13c + fVar102;
    local_238._0_4_ = fStack_244 - fVar123;
    local_238._4_4_ = fStack_240 - fVar124;
    local_238._8_4_ = fStack_23c - fVar125;
    local_238._12_4_ = 0;
    fVar48 = fStack_144 - fVar48;
    fVar85 = fStack_140 - fVar85;
    fVar102 = fStack_13c - fVar102;
    fVar116 = fVar165 * fVar84 + fVar238 * fVar229;
    fVar118 = fVar165 * fVar86 + fVar238 * fVar235;
    fVar123 = fVar165 * fVar104 + fVar238 * fVar236;
    fVar124 = fVar165 * fVar115 + fVar238 * fVar237;
    fVar125 = fVar166 * fVar84 + fVar246 * fVar229;
    fVar138 = fVar166 * fVar86 + fVar246 * fVar235;
    fVar139 = fVar166 * fVar104 + fVar246 * fVar236;
    fVar140 = fVar166 * fVar115 + fVar246 * fVar237;
    fVar105 = (fVar192 * fVar84 + fVar165 * fVar229) * fVar84 + fVar229 * fVar116;
    fVar154 = (fVar192 * fVar86 + fVar165 * fVar235) * fVar86 + fVar235 * fVar118;
    fVar155 = (fVar192 * fVar104 + fVar165 * fVar236) * fVar104 + fVar236 * fVar123;
    fVar117 = (fVar192 * fVar115 + fVar165 * fVar237) * fVar115 + fVar237 * fVar124;
    fVar207 = (fVar193 * fVar84 + fVar166 * fVar229) * fVar84 + fVar229 * fVar125;
    fVar208 = (fVar193 * fVar86 + fVar166 * fVar235) * fVar86 + fVar235 * fVar138;
    fVar219 = (fVar193 * fVar104 + fVar166 * fVar236) * fVar104 + fVar236 * fVar139;
    fVar220 = (fVar193 * fVar115 + fVar166 * fVar237) * fVar115 + fVar237 * fVar140;
    fVar156 = fVar116 * fVar84 + (fVar238 * fVar84 + fVar221 * fVar229) * fVar229;
    fVar165 = fVar118 * fVar86 + (fVar238 * fVar86 + fVar221 * fVar235) * fVar235;
    fVar166 = fVar123 * fVar104 + (fVar238 * fVar104 + fVar221 * fVar236) * fVar236;
    fVar167 = fVar124 * fVar115 + (fVar238 * fVar115 + fVar221 * fVar237) * fVar237;
    fVar192 = fVar125 * fVar84 + (fVar246 * fVar84 + fVar226 * fVar229) * fVar229;
    fVar193 = fVar138 * fVar86 + (fVar246 * fVar86 + fVar226 * fVar235) * fVar235;
    fVar194 = fVar139 * fVar104 + (fVar246 * fVar104 + fVar226 * fVar236) * fVar236;
    fVar206 = fVar140 * fVar115 + (fVar246 * fVar115 + fVar226 * fVar237) * fVar237;
    fVar125 = fVar84 * fVar105 + fVar229 * fVar156;
    fVar138 = fVar86 * fVar154 + fVar235 * fVar165;
    fVar139 = fVar104 * fVar155 + fVar236 * fVar166;
    fVar140 = fVar115 * fVar117 + fVar237 * fVar167;
    fVar116 = fVar84 * fVar207 + fVar229 * fVar192;
    fVar118 = fVar86 * fVar208 + fVar235 * fVar193;
    fVar123 = fVar104 * fVar219 + fVar236 * fVar194;
    fVar124 = fVar115 * fVar220 + fVar237 * fVar206;
    fVar84 = (fVar165 - fVar154) * 3.0 * fVar227;
    fVar86 = (fVar166 - fVar155) * 3.0 * fVar227;
    fVar104 = (fVar167 - fVar117) * 3.0 * fVar227;
    fVar115 = (fVar193 - fVar208) * 3.0 * fVar227;
    fVar154 = (fVar194 - fVar219) * 3.0 * fVar227;
    fVar155 = (fVar206 - fVar220) * 3.0 * fVar227;
    local_f8._4_4_ = fVar139;
    local_f8._0_4_ = fVar138;
    local_f8._8_4_ = fVar140;
    local_f8._12_4_ = 0;
    local_118._4_4_ = fVar123;
    local_118._0_4_ = fVar118;
    local_118._8_4_ = fVar124;
    local_118._12_4_ = 0;
    local_138 = fVar125 + (fVar156 - fVar105) * 3.0 * fVar227;
    fStack_134 = fVar138 + fVar84;
    fStack_130 = fVar139 + fVar86;
    fStack_12c = fVar140 + fVar104;
    local_108 = fVar116 + (fVar192 - fVar207) * 3.0 * fVar227;
    fStack_104 = fVar118 + fVar115;
    fStack_100 = fVar123 + fVar154;
    fStack_fc = fVar124 + fVar155;
    local_d8._0_4_ = fVar138 - fVar84;
    local_d8._4_4_ = fVar139 - fVar86;
    local_d8._8_4_ = fVar140 - fVar104;
    local_d8._12_4_ = 0;
    local_128._0_4_ = fVar118 - fVar115;
    local_128._4_4_ = fVar123 - fVar154;
    local_128._8_4_ = fVar124 - fVar155;
    local_128._12_4_ = 0;
    fVar84 = (fVar138 - fStack_244) + (fVar125 - local_248);
    fVar86 = (fVar139 - fStack_240) + (fVar138 - fStack_244);
    fVar104 = (fVar140 - fStack_23c) + (fVar139 - fStack_240);
    fVar115 = (fVar140 - fStack_23c) + 0.0;
    local_e8._8_4_ = fStack_13c;
    local_e8._12_4_ = 0;
    fVar105 = (fVar118 - fStack_144) + (fVar116 - local_148);
    fVar154 = (fVar123 - fStack_140) + (fVar118 - fStack_144);
    fVar155 = (fVar124 - fStack_13c) + (fVar123 - fStack_140);
    fVar117 = (fVar124 - fStack_13c) + 0.0;
    auVar185._0_8_ =
         CONCAT44(fStack_144 * fVar86 - fStack_244 * fVar154,
                  local_148 * fVar84 - local_248 * fVar105);
    auVar185._8_4_ = fStack_140 * fVar104 - fStack_240 * fVar155;
    auVar185._12_4_ = fStack_13c * fVar115 - fStack_23c * fVar117;
    auVar128._0_4_ = (float)local_3d8._0_4_ * fVar84 - local_228 * fVar105;
    auVar128._4_4_ = (float)local_3d8._4_4_ * fVar86 - fStack_224 * fVar154;
    auVar128._8_4_ = fStack_3d0 * fVar104 - fStack_220 * fVar155;
    auVar128._12_4_ = fStack_3cc * fVar115 - fStack_21c * fVar117;
    auVar145._0_8_ =
         CONCAT44(fVar85 * fVar86 - fVar154 * local_238._4_4_,
                  fVar48 * fVar84 - fVar105 * local_238._0_4_);
    auVar145._8_4_ = fVar102 * fVar104 - fVar155 * local_238._8_4_;
    auVar145._12_4_ = fVar115 * 0.0 - fVar117 * 0.0;
    auVar242._0_4_ = fVar84 * fStack_144 - fVar105 * fStack_244;
    auVar242._4_4_ = fVar86 * fStack_140 - fVar154 * fStack_240;
    auVar242._8_4_ = fVar104 * fStack_13c - fVar155 * fStack_23c;
    auVar242._12_4_ = fVar115 * 0.0 - fVar117 * 0.0;
    auVar211._0_8_ =
         CONCAT44(fVar118 * fVar86 - fVar138 * fVar154,fVar116 * fVar84 - fVar125 * fVar105);
    auVar211._8_4_ = fVar123 * fVar104 - fVar139 * fVar155;
    auVar211._12_4_ = fVar124 * fVar115 - fVar140 * fVar117;
    auVar254._0_4_ = local_108 * fVar84 - local_138 * fVar105;
    auVar254._4_4_ = fStack_104 * fVar86 - fStack_134 * fVar154;
    auVar254._8_4_ = fStack_100 * fVar104 - fStack_130 * fVar155;
    auVar254._12_4_ = fStack_fc * fVar115 - fStack_12c * fVar117;
    auVar199._0_8_ =
         CONCAT44(local_128._4_4_ * fVar86 - fVar154 * local_d8._4_4_,
                  local_128._0_4_ * fVar84 - fVar105 * local_d8._0_4_);
    auVar199._8_4_ = local_128._8_4_ * fVar104 - fVar155 * local_d8._8_4_;
    auVar199._12_4_ = fVar115 * 0.0 - fVar117 * 0.0;
    auVar70._0_4_ = fVar84 * fVar118 - fVar105 * fVar138;
    auVar70._4_4_ = fVar86 * fVar123 - fVar154 * fVar139;
    auVar70._8_4_ = fVar104 * fVar124 - fVar155 * fVar140;
    auVar70._12_4_ = fVar115 * 0.0 - fVar117 * 0.0;
    auVar94._8_4_ = auVar185._8_4_;
    auVar94._0_8_ = auVar185._0_8_;
    auVar94._12_4_ = auVar185._12_4_;
    auVar56 = minps(auVar94,auVar128);
    auVar92 = maxps(auVar185,auVar128);
    auVar129._8_4_ = auVar145._8_4_;
    auVar129._0_8_ = auVar145._0_8_;
    auVar129._12_4_ = auVar145._12_4_;
    auVar210 = minps(auVar129,auVar242);
    auVar56 = minps(auVar56,auVar210);
    auVar210 = maxps(auVar145,auVar242);
    auVar107 = maxps(auVar92,auVar210);
    auVar130._8_4_ = auVar211._8_4_;
    auVar130._0_8_ = auVar211._0_8_;
    auVar130._12_4_ = auVar211._12_4_;
    auVar210 = minps(auVar130,auVar254);
    auVar212 = maxps(auVar211,auVar254);
    auVar146._8_4_ = auVar199._8_4_;
    auVar146._0_8_ = auVar199._0_8_;
    auVar146._12_4_ = auVar199._12_4_;
    auVar92 = minps(auVar146,auVar70);
    auVar210 = minps(auVar210,auVar92);
    auVar56 = minps(auVar56,auVar210);
    auVar210 = maxps(auVar199,auVar70);
    auVar210 = maxps(auVar212,auVar210);
    auVar210 = maxps(auVar107,auVar210);
    auVar186._0_4_ =
         -(uint)(local_268 <= auVar210._0_4_ && auVar56._0_4_ <= local_258) & local_158._0_4_;
    auVar186._4_4_ =
         -(uint)(fStack_264 <= auVar210._4_4_ && auVar56._4_4_ <= fStack_254) & local_158._4_4_;
    auVar186._8_4_ =
         -(uint)(fStack_260 <= auVar210._8_4_ && auVar56._8_4_ <= fStack_250) & local_158._8_4_;
    auVar186._12_4_ =
         -(uint)(fStack_25c <= auVar210._12_4_ && auVar56._12_4_ <= fStack_24c) & local_158._12_4_;
    uVar41 = movmskps((int)uVar37,auVar186);
    local_298.ray = (RTCRayN *)(ulong)uVar41;
    if (uVar41 != 0) {
      fVar84 = (fVar138 - fVar125) + (fStack_244 - local_248);
      fVar86 = (fVar139 - fVar138) + (fStack_240 - fStack_244);
      fVar104 = (fVar140 - fVar139) + (fStack_23c - fStack_240);
      fVar115 = (0.0 - fVar140) + (0.0 - fStack_23c);
      fVar105 = (fVar118 - fVar116) + (fStack_144 - local_148);
      fVar154 = (fVar123 - fVar118) + (fStack_140 - fStack_144);
      fVar155 = (fVar124 - fVar123) + (fStack_13c - fStack_140);
      fVar117 = (0.0 - fVar124) + (0.0 - fStack_13c);
      auVar243._0_8_ =
           CONCAT44(fStack_144 * fVar86 - fStack_244 * fVar154,
                    local_148 * fVar84 - local_248 * fVar105);
      auVar243._8_4_ = fStack_140 * fVar104 - fStack_240 * fVar155;
      auVar243._12_4_ = fStack_13c * fVar115 - fStack_23c * fVar117;
      auVar131._0_4_ = (float)local_3d8._0_4_ * fVar84 - local_228 * fVar105;
      auVar131._4_4_ = (float)local_3d8._4_4_ * fVar86 - fStack_224 * fVar154;
      auVar131._8_4_ = fStack_3d0 * fVar104 - fStack_220 * fVar155;
      auVar131._12_4_ = fStack_3cc * fVar115 - fStack_21c * fVar117;
      auVar163._0_8_ =
           CONCAT44(fVar85 * fVar86 - local_238._4_4_ * fVar154,
                    fVar48 * fVar84 - local_238._0_4_ * fVar105);
      auVar163._8_4_ = fVar102 * fVar104 - local_238._8_4_ * fVar155;
      auVar163._12_4_ = fVar115 * 0.0 - fVar117 * 0.0;
      auVar147._0_4_ = fStack_144 * fVar84 - fStack_244 * fVar105;
      auVar147._4_4_ = fStack_140 * fVar86 - fStack_240 * fVar154;
      auVar147._8_4_ = fStack_13c * fVar104 - fStack_23c * fVar155;
      auVar147._12_4_ = fVar115 * 0.0 - fVar117 * 0.0;
      auVar112._0_8_ =
           CONCAT44(fVar118 * fVar86 - fVar138 * fVar154,fVar116 * fVar84 - fVar125 * fVar105);
      auVar112._8_4_ = fVar123 * fVar104 - fVar139 * fVar155;
      auVar112._12_4_ = fVar124 * fVar115 - fVar140 * fVar117;
      auVar200._0_4_ = local_108 * fVar84 - local_138 * fVar105;
      auVar200._4_4_ = fStack_104 * fVar86 - fStack_134 * fVar154;
      auVar200._8_4_ = fStack_100 * fVar104 - fStack_130 * fVar155;
      auVar200._12_4_ = fStack_fc * fVar115 - fStack_12c * fVar117;
      auVar213._0_8_ =
           CONCAT44(local_128._4_4_ * fVar86 - local_d8._4_4_ * fVar154,
                    local_128._0_4_ * fVar84 - local_d8._0_4_ * fVar105);
      auVar213._8_4_ = local_128._8_4_ * fVar104 - local_d8._8_4_ * fVar155;
      auVar213._12_4_ = fVar115 * 0.0 - fVar117 * 0.0;
      auVar71._0_4_ = fVar84 * fVar118 - fVar105 * fVar138;
      auVar71._4_4_ = fVar86 * fVar123 - fVar154 * fVar139;
      auVar71._8_4_ = fVar104 * fVar124 - fVar155 * fVar140;
      auVar71._12_4_ = fVar115 * 0.0 - fVar117 * 0.0;
      auVar95._8_4_ = auVar243._8_4_;
      auVar95._0_8_ = auVar243._0_8_;
      auVar95._12_4_ = auVar243._12_4_;
      auVar56 = minps(auVar95,auVar131);
      auVar92 = maxps(auVar243,auVar131);
      auVar132._8_4_ = auVar163._8_4_;
      auVar132._0_8_ = auVar163._0_8_;
      auVar132._12_4_ = auVar163._12_4_;
      auVar210 = minps(auVar132,auVar147);
      auVar56 = minps(auVar56,auVar210);
      auVar210 = maxps(auVar163,auVar147);
      auVar212 = maxps(auVar92,auVar210);
      auVar133._8_4_ = auVar112._8_4_;
      auVar133._0_8_ = auVar112._0_8_;
      auVar133._12_4_ = auVar112._12_4_;
      auVar92 = minps(auVar133,auVar200);
      auVar210 = maxps(auVar112,auVar200);
      auVar148._8_4_ = auVar213._8_4_;
      auVar148._0_8_ = auVar213._0_8_;
      auVar148._12_4_ = auVar213._12_4_;
      auVar107 = minps(auVar148,auVar71);
      auVar92 = minps(auVar92,auVar107);
      auVar56 = minps(auVar56,auVar92);
      auVar92 = maxps(auVar213,auVar71);
      auVar210 = maxps(auVar210,auVar92);
      auVar210 = maxps(auVar212,auVar210);
      auVar244._0_4_ =
           -(uint)(local_268 <= auVar210._0_4_ && auVar56._0_4_ <= local_258) & auVar186._0_4_;
      auVar244._4_4_ =
           -(uint)(fStack_264 <= auVar210._4_4_ && auVar56._4_4_ <= fStack_254) & auVar186._4_4_;
      auVar244._8_4_ =
           -(uint)(fStack_260 <= auVar210._8_4_ && auVar56._8_4_ <= fStack_250) & auVar186._8_4_;
      auVar244._12_4_ =
           -(uint)(fStack_25c <= auVar210._12_4_ && auVar56._12_4_ <= fStack_24c) & auVar186._12_4_;
      uVar41 = movmskps(uVar41,auVar244);
      local_298.ray = (RTCRayN *)(ulong)uVar41;
      if (uVar41 != 0) {
        local_298.ray = (RTCRayN *)(ulong)(byte)uVar41;
        afStack_1e8[uVar39] = (float)(uVar41 & 0xff);
        *(ulong *)(afStack_78 + uVar39 * 2) = CONCAT44(fStack_394,local_398);
        *(ulong *)(afStack_58 + uVar39 * 2) = CONCAT44(fStack_41c,local_428._4_4_);
        uVar39 = (ulong)((int)uVar39 + 1);
      }
    }
LAB_00a8dbde:
    if ((int)uVar39 == 0) {
      fVar103 = (&paVar34->field_1)[2].x;
      auVar101._4_4_ = -(uint)(fStack_1a4 <= fVar103);
      auVar101._0_4_ = -(uint)(local_1a8 <= fVar103);
      auVar101._8_4_ = -(uint)(fStack_1a0 <= fVar103);
      auVar101._12_4_ = -(uint)(fStack_19c <= fVar103);
      uVar41 = movmskps((int)local_298.ray,auVar101);
      uVar41 = (uint)uVar38 & uVar41;
      if (uVar41 == 0) {
        return;
      }
      goto LAB_00a8cce6;
    }
    uVar41 = (int)uVar39 - 1;
    uVar37 = (ulong)uVar41;
    fVar48 = afStack_1e8[uVar37];
    local_428._4_4_ = afStack_58[uVar37 * 2];
    fStack_41c = afStack_58[uVar37 * 2 + 1];
    uVar9 = 0;
    if (fVar48 != 0.0) {
      for (; ((uint)fVar48 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
      }
    }
    fVar48 = (float)((int)fVar48 - 1U & (uint)fVar48);
    afStack_1e8[uVar37] = fVar48;
    if (fVar48 == 0.0) {
      uVar39 = (ulong)uVar41;
    }
    fVar85 = (float)(uVar9 + 1) * 0.33333334;
    fVar48 = afStack_78[uVar37 * 2];
    fVar84 = afStack_78[uVar37 * 2 + 1];
    local_398 = fVar48 * (1.0 - (float)uVar9 * 0.33333334) + fVar84 * (float)uVar9 * 0.33333334;
    fStack_394 = fVar48 * (1.0 - fVar85) + fVar84 * fVar85;
    fStack_390 = fVar48 * 0.0 + fVar84 * 0.0;
    fStack_38c = fVar48 * 0.0 + fVar84 * 0.0;
    fVar85 = fStack_394 - local_398;
    fVar123 = (float)local_3a8;
    fVar124 = local_3a8._4_4_;
    fVar48 = (float)uStack_3a0;
    fVar84 = uStack_3a0._4_4_;
    if (fVar85 < 0.16666667) {
      fVar118 = 1.0 - (float)local_428._4_4_;
      fVar138 = 1.0 - (float)local_428._4_4_;
      fVar105 = 1.0 - fStack_41c;
      fVar154 = 1.0 - fStack_41c;
      fVar116 = (float)local_2b8._0_4_ * fVar118 + local_2e8 * (float)local_428._4_4_;
      fVar125 = (float)local_2b8._4_4_ * fVar138 + fStack_2e4 * (float)local_428._4_4_;
      fVar139 = fStack_2b0 * fVar105 + fStack_2e0 * fStack_41c;
      fVar140 = fStack_2ac * fVar154 + fStack_2dc * fStack_41c;
      fVar86 = (float)local_2c8._0_4_ * fVar118 + (float)local_2f8._0_4_ * (float)local_428._4_4_;
      fVar102 = (float)local_2c8._4_4_ * fVar138 + (float)local_2f8._4_4_ * (float)local_428._4_4_;
      fVar104 = fStack_2c0 * fVar105 + fStack_2f0 * fStack_41c;
      fVar115 = fStack_2bc * fVar154 + fStack_2ec * fStack_41c;
      fVar166 = (float)local_2d8._0_4_ * fVar118 + local_308 * (float)local_428._4_4_;
      fVar192 = (float)local_2d8._4_4_ * fVar138 + fStack_304 * (float)local_428._4_4_;
      fVar194 = fStack_2d0 * fVar105 + fStack_300 * fStack_41c;
      fVar207 = fStack_2cc * fVar154 + fStack_2fc * fStack_41c;
      fVar155 = (fVar118 * (float)local_3a8 + (float)local_428._4_4_ * (float)local_318._0_4_) -
                fVar166;
      fVar117 = (fVar138 * local_3a8._4_4_ + (float)local_428._4_4_ * (float)local_318._4_4_) -
                fVar192;
      fVar156 = (fVar105 * (float)uStack_3a0 + fStack_41c * fStack_310) - fVar194;
      fVar165 = (fVar154 * uStack_3a0._4_4_ + fStack_41c * fStack_30c) - fVar207;
      fVar118 = local_398 * (fVar166 - fVar86) + fVar86;
      fVar138 = local_398 * (fVar192 - fVar102) + fVar102;
      fVar105 = local_398 * (fVar194 - fVar104) + fVar104;
      fVar154 = local_398 * (fVar207 - fVar115) + fVar115;
      fVar167 = (fVar166 - fVar86) * fStack_394 + fVar86;
      fVar193 = (fVar192 - fVar102) * fStack_394 + fVar102;
      fVar206 = (fVar194 - fVar104) * fStack_394 + fVar104;
      fVar208 = (fVar207 - fVar115) * fStack_394 + fVar115;
      fVar219 = local_398 * (fVar86 - fVar116) + fVar116;
      fVar220 = local_398 * (fVar102 - fVar125) + fVar125;
      fVar221 = local_398 * (fVar104 - fVar139) + fVar139;
      fVar226 = local_398 * (fVar115 - fVar140) + fVar140;
      fVar219 = (fVar118 - fVar219) * local_398 + fVar219;
      fVar220 = (fVar138 - fVar220) * local_398 + fVar220;
      fVar221 = (fVar105 - fVar221) * local_398 + fVar221;
      fVar226 = (fVar154 - fVar226) * local_398 + fVar226;
      fVar118 = (((local_398 * fVar155 + fVar166) - fVar118) * local_398 + fVar118) - fVar219;
      fVar138 = (((local_398 * fVar117 + fVar192) - fVar138) * local_398 + fVar138) - fVar220;
      fVar105 = (((local_398 * fVar156 + fVar194) - fVar105) * local_398 + fVar105) - fVar221;
      fVar154 = (((local_398 * fVar165 + fVar207) - fVar154) * local_398 + fVar154) - fVar226;
      auVar113._0_4_ = local_398 * fVar118 + fVar219;
      auVar113._4_4_ = local_398 * fVar138 + fVar220;
      auVar113._8_4_ = local_398 * fVar105 + fVar221;
      auVar113._12_4_ = local_398 * fVar154 + fVar226;
      fVar116 = (fVar86 - fVar116) * fStack_394 + fVar116;
      fVar125 = (fVar102 - fVar125) * fStack_394 + fVar125;
      fVar139 = (fVar104 - fVar139) * fStack_394 + fVar139;
      fVar140 = (fVar115 - fVar140) * fStack_394 + fVar140;
      fVar116 = (fVar167 - fVar116) * fStack_394 + fVar116;
      fVar125 = (fVar193 - fVar125) * fStack_394 + fVar125;
      fVar139 = (fVar206 - fVar139) * fStack_394 + fVar139;
      fVar140 = (fVar208 - fVar140) * fStack_394 + fVar140;
      fVar102 = (((fVar155 * fStack_394 + fVar166) - fVar167) * fStack_394 + fVar167) - fVar116;
      fVar104 = (((fVar117 * fStack_394 + fVar192) - fVar193) * fStack_394 + fVar193) - fVar125;
      fVar115 = (((fVar156 * fStack_394 + fVar194) - fVar206) * fStack_394 + fVar206) - fVar139;
      fVar193 = (((fVar165 * fStack_394 + fVar207) - fVar208) * fStack_394 + fVar208) - fVar140;
      fVar116 = fStack_394 * fVar102 + fVar116;
      fVar125 = fStack_394 * fVar104 + fVar125;
      fVar139 = fStack_394 * fVar115 + fVar139;
      fVar140 = fStack_394 * fVar193 + fVar140;
      fVar86 = fVar85 * 0.33333334;
      fVar155 = fVar118 * 3.0 * fVar86 + auVar113._0_4_;
      fVar117 = fVar138 * 3.0 * fVar86 + auVar113._4_4_;
      fVar156 = fVar105 * 3.0 * fVar86 + auVar113._8_4_;
      fVar165 = fVar154 * 3.0 * fVar86 + auVar113._12_4_;
      fVar166 = fVar116 - fVar86 * fVar102 * 3.0;
      fVar167 = fVar125 - fVar86 * fVar104 * 3.0;
      fVar192 = fVar139 - fVar86 * fVar115 * 3.0;
      fVar193 = fVar140 - fVar86 * fVar193 * 3.0;
      auVar12._4_8_ = auVar254._8_8_;
      auVar12._0_4_ = auVar113._4_4_;
      auVar253._0_8_ = auVar12._0_8_ << 0x20;
      auVar253._8_4_ = auVar113._8_4_;
      auVar253._12_4_ = auVar113._12_4_;
      auVar254._8_8_ = auVar113._8_8_;
      auVar254._0_8_ = auVar253._8_8_;
      fVar118 = (fVar139 - fVar116) + (auVar113._8_4_ - auVar113._0_4_);
      fVar138 = (fVar140 - fVar125) + (auVar113._12_4_ - auVar113._4_4_);
      auVar214._0_4_ = fVar167 * fVar138;
      auVar214._4_4_ = fVar167 * fVar138;
      auVar214._8_4_ = fVar193 * fVar138;
      auVar214._12_4_ = fVar193 * fVar138;
      fVar86 = auVar113._0_4_ * fVar118 + auVar113._4_4_ * fVar138;
      fVar102 = auVar113._8_4_ * fVar118 + auVar113._12_4_ * fVar138;
      fVar105 = fVar155 * fVar118 + fVar117 * fVar138;
      fVar154 = fVar156 * fVar118 + fVar165 * fVar138;
      fVar194 = fVar166 * fVar118 + auVar214._0_4_;
      auVar187._0_8_ = CONCAT44(fVar167 * fVar118 + auVar214._4_4_,fVar194);
      auVar187._8_4_ = fVar192 * fVar118 + auVar214._8_4_;
      auVar187._12_4_ = fVar193 * fVar118 + auVar214._12_4_;
      fVar115 = fVar118 * fVar116 + fVar138 * fVar125;
      fVar206 = fVar118 * fVar139 + fVar138 * fVar140;
      auVar13._4_8_ = auVar214._8_8_;
      auVar13._0_4_ = fVar117 * fVar118 + fVar117 * fVar138;
      auVar215._0_8_ = auVar13._0_8_ << 0x20;
      auVar215._8_4_ = fVar154;
      auVar215._12_4_ = fVar165 * fVar118 + fVar165 * fVar138;
      fVar104 = fVar105;
      if (fVar105 <= fVar86) {
        fVar104 = fVar86;
        fVar86 = fVar105;
      }
      auVar216._8_8_ = auVar215._8_8_;
      auVar216._0_8_ = auVar216._8_8_;
      auVar72._8_4_ = auVar187._8_4_;
      auVar72._0_8_ = auVar187._0_8_;
      auVar72._12_4_ = auVar187._12_4_;
      if (fVar115 <= fVar194) {
        auVar72._0_4_ = fVar115;
      }
      if (auVar72._0_4_ <= fVar86) {
        fVar86 = auVar72._0_4_;
      }
      auVar14._4_8_ = auVar72._8_8_;
      auVar14._0_4_ = fVar118 * fVar125 + fVar138 * fVar125;
      auVar73._0_8_ = auVar14._0_8_ << 0x20;
      auVar73._8_4_ = fVar206;
      auVar73._12_4_ = fVar118 * fVar140 + fVar138 * fVar140;
      if (fVar115 <= fVar194) {
        fVar115 = fVar194;
      }
      auVar74._8_8_ = auVar73._8_8_;
      auVar74._0_8_ = auVar74._8_8_;
      if (fVar115 <= fVar104) {
        fVar115 = fVar104;
      }
      if (fVar154 <= fVar102) {
        auVar216._0_4_ = fVar102;
        fVar102 = fVar154;
      }
      auVar96._8_4_ = auVar187._8_4_;
      auVar96._0_8_ = auVar187._8_8_;
      auVar96._12_4_ = auVar187._12_4_;
      if (fVar206 <= auVar187._8_4_) {
        auVar96._0_4_ = fVar206;
      }
      if (auVar96._0_4_ <= fVar102) {
        fVar102 = auVar96._0_4_;
      }
      if (fVar206 <= auVar187._8_4_) {
        auVar74._0_4_ = auVar187._8_4_;
      }
      if (auVar74._0_4_ <= auVar216._0_4_) {
        auVar74._0_4_ = auVar216._0_4_;
      }
      bVar40 = 3 < (uint)uVar39;
      uVar15 = (undefined3)(uVar41 >> 8);
      local_298.ray = (RTCRayN *)(ulong)CONCAT31(uVar15,bVar40);
      fVar104 = auVar74._0_4_;
      if ((0.0001 <= fVar86) || (fVar104 <= -0.0001)) break;
      goto LAB_00a8df49;
    }
  } while( true );
  if ((fVar102 < 0.0001 && -0.0001 < fVar115) ||
     ((fVar86 < 0.0001 && -0.0001 < fVar115 || (fVar102 < 0.0001 && -0.0001 < fVar104)))) {
LAB_00a8df49:
    bVar40 = bVar40 || fVar85 < 0.001;
    local_298.ray = (RTCRayN *)(ulong)CONCAT31(uVar15,bVar40);
    fVar138 = (float)(~-(uint)(fVar86 < 0.0) & 0x3f800000 | -(uint)(fVar86 < 0.0) & 0xbf800000);
    fVar105 = (float)(~-(uint)(fVar115 < 0.0) & 0x3f800000 | -(uint)(fVar115 < 0.0) & 0xbf800000);
    fVar118 = 0.0;
    if ((fVar138 == fVar105) && (!NAN(fVar138) && !NAN(fVar105))) {
      fVar118 = INFINITY;
    }
    _local_3d8 = auVar254;
    fVar154 = 0.0;
    if ((fVar138 == fVar105) && (!NAN(fVar138) && !NAN(fVar105))) {
      fVar154 = -INFINITY;
    }
    uVar37 = (ulong)~-(uint)(fVar102 < 0.0) & 0xffffffff3f800000 |
             (ulong)-(uint)(fVar102 < 0.0) & 0xffffffffbf800000;
    auVar254._8_8_ = 0;
    auVar254._0_8_ = uVar37;
    fVar194 = (float)uVar37;
    if ((fVar138 != fVar194) || (fVar206 = fVar154, NAN(fVar138) || NAN(fVar194))) {
      if ((fVar102 != fVar86) || (NAN(fVar102) || NAN(fVar86))) {
        fVar102 = -fVar86 / (fVar102 - fVar86);
        fVar102 = (1.0 - fVar102) * 0.0 + fVar102;
        fVar206 = fVar102;
      }
      else {
        fVar102 = 0.0;
        if ((fVar86 != 0.0) || (fVar206 = 1.0, NAN(fVar86))) {
          fVar102 = INFINITY;
          fVar206 = -INFINITY;
        }
      }
      if (fVar102 <= fVar118) {
        fVar118 = fVar102;
      }
      if (fVar206 <= fVar154) {
        fVar206 = fVar154;
      }
    }
    fVar86 = *(float *)(&DAT_01f80eb4 + (ulong)(fVar104 < 0.0) * 4);
    if ((fVar105 != fVar86) || (fVar102 = fVar206, NAN(fVar105) || NAN(fVar86))) {
      if ((fVar104 != fVar115) || (NAN(fVar104) || NAN(fVar115))) {
        fVar138 = -fVar115 / (fVar104 - fVar115);
        fVar138 = (1.0 - fVar138) * 0.0 + fVar138;
        fVar102 = fVar138;
      }
      else {
        fVar138 = 0.0;
        if ((fVar115 != 0.0) || (fVar102 = 1.0, NAN(fVar115))) {
          fVar138 = INFINITY;
          fVar102 = -INFINITY;
        }
      }
      if (fVar138 <= fVar118) {
        fVar118 = fVar138;
      }
      if (fVar102 <= fVar206) {
        fVar102 = fVar206;
      }
    }
    if ((fVar194 != fVar86) || (NAN(fVar194) || NAN(fVar86))) {
      fVar118 = (float)(~-(uint)(fVar118 < 1.0) & 0x3f800000 |
                       (uint)fVar118 & -(uint)(fVar118 < 1.0));
      fVar102 = (float)(~-(uint)(fVar102 < 1.0) & (uint)fVar102 |
                       -(uint)(fVar102 < 1.0) & 0x3f800000);
    }
    fVar118 = (float)(~-(uint)(fVar118 < 0.0) & (uint)fVar118);
    fVar86 = (float)(~-(uint)(fVar102 < 1.0) & 0x3f800000 | (uint)fVar102 & -(uint)(fVar102 < 1.0));
    if (fVar118 <= fVar86) {
      fVar118 = fVar118 + -0.1;
      fVar86 = fVar86 + 0.1;
      uVar41 = -(uint)(fVar86 < 1.0);
      fVar118 = (float)(~-(uint)(fVar118 < 0.0) & (uint)fVar118);
      fVar86 = (float)(~uVar41 & 0x3f800000 | (uint)fVar86 & uVar41);
      fVar206 = 1.0 - fVar118;
      fVar207 = 1.0 - fVar118;
      fVar208 = 1.0 - fVar86;
      fVar219 = 1.0 - fVar86;
      fVar102 = auVar113._0_4_ * fVar206 + auVar113._8_4_ * fVar118;
      fVar115 = auVar113._4_4_ * fVar207 + auVar113._12_4_ * fVar118;
      fVar138 = auVar113._0_4_ * fVar208 + auVar113._8_4_ * fVar86;
      fVar105 = auVar113._4_4_ * fVar219 + auVar113._12_4_ * fVar86;
      fVar154 = fVar155 * fVar206 + fVar156 * fVar118;
      fVar194 = fVar117 * fVar207 + fVar165 * fVar118;
      fVar155 = fVar155 * fVar208 + fVar156 * fVar86;
      fVar117 = fVar117 * fVar219 + fVar165 * fVar86;
      fVar156 = fVar166 * fVar206 + fVar192 * fVar118;
      fVar165 = fVar167 * fVar207 + fVar193 * fVar118;
      fVar166 = fVar166 * fVar208 + fVar192 * fVar86;
      fVar167 = fVar167 * fVar219 + fVar193 * fVar86;
      fVar192 = fVar206 * fVar116 + fVar139 * fVar118;
      fVar193 = fVar207 * fVar125 + fVar140 * fVar118;
      fVar116 = fVar208 * fVar116 + fVar139 * fVar86;
      fVar125 = fVar219 * fVar125 + fVar140 * fVar86;
      fVar139 = (float)local_428._4_4_ * (1.0 - fVar86);
      local_428._4_4_ = (float)local_428._4_4_ * (1.0 - fVar118) + fStack_41c * fVar118;
      fStack_41c = fVar139 + fStack_41c * fVar86;
      fVar85 = 1.0 / fVar85;
      auVar97._0_4_ = fVar116 - fVar192;
      auVar97._4_4_ = fVar125 - fVar193;
      auVar97._8_4_ = fVar116 - fVar116;
      auVar97._12_4_ = fVar125 - fVar125;
      auVar121._0_8_ = CONCAT44(fVar167 - fVar165,fVar166 - fVar156);
      auVar121._8_4_ = fVar166 - fVar166;
      auVar121._12_4_ = fVar167 - fVar167;
      auVar149._0_4_ = fVar155 - fVar154;
      auVar149._4_4_ = fVar117 - fVar194;
      auVar149._8_4_ = fVar155 - fVar155;
      auVar149._12_4_ = fVar117 - fVar117;
      auVar217._0_8_ = CONCAT44((fVar194 - fVar115) * 3.0,(fVar154 - fVar102) * 3.0);
      auVar217._8_4_ = (fVar155 - fVar138) * 3.0;
      auVar217._12_4_ = (fVar117 - fVar105) * 3.0;
      auVar134._0_8_ = CONCAT44((fVar165 - fVar194) * 3.0,(fVar156 - fVar154) * 3.0);
      auVar134._8_4_ = (fVar166 - fVar155) * 3.0;
      auVar134._12_4_ = (fVar167 - fVar117) * 3.0;
      auVar231._0_4_ = (fVar192 - fVar156) * 3.0;
      auVar231._4_4_ = (fVar193 - fVar165) * 3.0;
      auVar231._8_4_ = (fVar116 - fVar166) * 3.0;
      auVar231._12_4_ = (fVar125 - fVar167) * 3.0;
      auVar188._8_4_ = auVar134._8_4_;
      auVar188._0_8_ = auVar134._0_8_;
      auVar188._12_4_ = auVar134._12_4_;
      auVar210 = minps(auVar188,auVar231);
      auVar56 = maxps(auVar134,auVar231);
      auVar222._8_4_ = auVar217._8_4_;
      auVar222._0_8_ = auVar217._0_8_;
      auVar222._12_4_ = auVar217._12_4_;
      auVar107 = minps(auVar222,auVar210);
      auVar92 = maxps(auVar217,auVar56);
      auVar16._4_8_ = auVar56._8_8_;
      auVar16._0_4_ = auVar107._4_4_;
      auVar135._0_8_ = auVar16._0_8_ << 0x20;
      auVar135._8_4_ = auVar107._8_4_;
      auVar135._12_4_ = auVar107._12_4_;
      auVar136._8_8_ = auVar107._8_8_;
      auVar136._0_8_ = auVar135._8_8_;
      auVar17._4_8_ = auVar210._8_8_;
      auVar17._0_4_ = auVar92._4_4_;
      auVar189._0_8_ = auVar17._0_8_ << 0x20;
      auVar189._8_4_ = auVar92._8_4_;
      auVar189._12_4_ = auVar92._12_4_;
      auVar190._8_8_ = auVar92._8_8_;
      auVar190._0_8_ = auVar189._8_8_;
      auVar210 = minps(auVar107,auVar136);
      auVar56 = maxps(auVar92,auVar190);
      fVar219 = auVar210._0_4_ * fVar85;
      fVar220 = auVar210._4_4_ * fVar85;
      fVar221 = auVar210._8_4_ * fVar85;
      fVar226 = auVar210._12_4_ * fVar85;
      fVar117 = fVar85 * auVar56._0_4_;
      fVar165 = fVar85 * auVar56._4_4_;
      fVar167 = fVar85 * auVar56._8_4_;
      fVar85 = fVar85 * auVar56._12_4_;
      fVar207 = 1.0 / (fStack_41c - (float)local_428._4_4_);
      auVar75._0_8_ = CONCAT44(fVar105 - fVar115,fVar138 - fVar102);
      auVar75._8_4_ = fVar138 - fVar138;
      auVar75._12_4_ = fVar105 - fVar105;
      auVar201._8_4_ = auVar75._8_4_;
      auVar201._0_8_ = auVar75._0_8_;
      auVar201._12_4_ = auVar75._12_4_;
      auVar92 = minps(auVar201,auVar149);
      auVar56 = maxps(auVar75,auVar149);
      auVar114._8_4_ = auVar121._8_4_;
      auVar114._0_8_ = auVar121._0_8_;
      auVar114._12_4_ = auVar121._12_4_;
      auVar210 = minps(auVar114,auVar97);
      auVar92 = minps(auVar92,auVar210);
      auVar210 = maxps(auVar121,auVar97);
      auVar56 = maxps(auVar56,auVar210);
      fVar194 = auVar92._0_4_ * fVar207;
      fVar206 = auVar92._4_4_ * fVar207;
      fVar208 = fVar207 * auVar56._0_4_;
      fVar207 = fVar207 * auVar56._4_4_;
      local_428._0_4_ = local_398;
      fStack_420 = fStack_394;
      auVar191._4_4_ = fStack_41c;
      auVar191._0_4_ = fStack_394;
      auVar191._8_4_ = fStack_390;
      auVar191._12_4_ = fStack_38c;
      local_1cc = (local_398 + fStack_394) * 0.5;
      fVar140 = ((float)local_428._4_4_ + fStack_41c) * 0.5;
      fVar105 = (fStack_394 + fStack_390) * 0.0;
      fVar154 = (fStack_41c + fStack_38c) * 0.0;
      fVar86 = local_a8 * local_1cc + local_3ec.m128[1];
      fVar102 = fStack_a4 * local_1cc + local_3ec.m128[2];
      fVar115 = fStack_a0 * local_1cc + local_3ec.m128[3];
      fVar116 = fStack_9c * local_1cc + fStack_3dc;
      fVar118 = local_b8 * local_1cc + (float)local_388._0_4_;
      fVar125 = fStack_b4 * local_1cc + (float)local_388._4_4_;
      fVar138 = fStack_b0 * local_1cc + fStack_380;
      fVar139 = fStack_ac * local_1cc + fStack_37c;
      fVar86 = (fVar118 - fVar86) * local_1cc + fVar86;
      fVar102 = (fVar125 - fVar102) * local_1cc + fVar102;
      fVar115 = (fVar138 - fVar115) * local_1cc + fVar115;
      fVar116 = (fVar139 - fVar116) * local_1cc + fVar116;
      fVar118 = (((local_c8 * local_1cc + (float)local_1f8) - fVar118) * local_1cc + fVar118) -
                fVar86;
      fVar125 = (((fStack_c4 * local_1cc + local_1f8._4_4_) - fVar125) * local_1cc + fVar125) -
                fVar102;
      fVar138 = (((fStack_c0 * local_1cc + fStack_1f0) - fVar138) * local_1cc + fVar138) - fVar115;
      fVar139 = (((fStack_bc * local_1cc + fStack_1ec) - fVar139) * local_1cc + fVar139) - fVar116;
      fVar86 = local_1cc * fVar118 + fVar86;
      fVar102 = local_1cc * fVar125 + fVar102;
      fVar118 = fVar118 * 3.0;
      fVar125 = fVar125 * 3.0;
      fVar115 = (local_1cc * fVar138 + fVar115) - fVar86;
      fVar116 = (local_1cc * fVar139 + fVar116) - fVar102;
      fVar118 = (fVar138 * 3.0 - fVar118) * fVar140 + fVar118;
      fVar125 = (fVar139 * 3.0 - fVar125) * fVar140 + fVar125;
      auVar122._0_8_ = CONCAT44(fVar118,fVar115) ^ 0x80000000;
      auVar122._8_4_ = fVar118;
      auVar122._12_4_ = fVar118;
      fVar227 = local_398 - local_1cc;
      fVar229 = (float)local_428._4_4_ - fVar140;
      fVar235 = fStack_394 - fVar105;
      fVar236 = fStack_41c - fVar154;
      fVar237 = fStack_394 - local_1cc;
      fVar238 = fStack_41c - fVar140;
      fVar105 = fStack_390 - fVar105;
      fVar154 = fStack_38c - fVar154;
      fVar86 = fVar115 * fVar140 + fVar86;
      fVar102 = fVar116 * fVar140 + fVar102;
      auVar137._0_8_ = CONCAT44(fVar125,fVar116) ^ 0x8000000000000000;
      auVar137._8_4_ = -fVar125;
      auVar137._12_4_ = -fVar125;
      auVar76._0_4_ = fVar116 * fVar118 - fVar125 * fVar115;
      auVar76._4_4_ = auVar76._0_4_;
      auVar76._8_4_ = auVar76._0_4_;
      auVar76._12_4_ = auVar76._0_4_;
      auVar210 = divps(auVar137,auVar76);
      auVar56 = divps(auVar122,auVar76);
      fVar139 = auVar210._0_4_;
      fVar155 = auVar210._4_4_;
      fVar125 = auVar56._0_4_;
      fVar138 = auVar56._4_4_;
      local_1cc = local_1cc - (fVar102 * fVar125 + fVar86 * fVar139);
      fStack_1c8 = fVar140 - (fVar102 * fVar138 + fVar86 * fVar155);
      fVar118 = fVar140 - (fVar102 * auVar56._8_4_ + fVar86 * auVar210._8_4_);
      fVar140 = fVar140 - (fVar102 * auVar56._12_4_ + fVar86 * auVar210._12_4_);
      auVar98._0_8_ = CONCAT44(fVar155 * fVar194,fVar155 * fVar219);
      auVar98._8_4_ = fVar155 * fVar220;
      auVar98._12_4_ = fVar155 * fVar206;
      auVar77._0_4_ = fVar155 * fVar117;
      auVar77._4_4_ = fVar155 * fVar208;
      auVar77._8_4_ = fVar155 * fVar165;
      auVar77._12_4_ = fVar155 * fVar207;
      auVar259._8_4_ = auVar98._8_4_;
      auVar259._0_8_ = auVar98._0_8_;
      auVar259._12_4_ = auVar98._12_4_;
      auVar107 = minps(auVar259,auVar77);
      auVar56 = maxps(auVar77,auVar98);
      auVar150._0_8_ = CONCAT44(fVar138 * fVar206,fVar138 * fVar220);
      auVar150._8_4_ = fVar138 * fVar221;
      auVar150._12_4_ = fVar138 * fVar226;
      auVar99._0_4_ = fVar138 * fVar165;
      auVar99._4_4_ = fVar138 * fVar207;
      auVar99._8_4_ = fVar138 * fVar167;
      auVar99._12_4_ = fVar138 * fVar85;
      auVar223._8_4_ = auVar150._8_4_;
      auVar223._0_8_ = auVar150._0_8_;
      auVar223._12_4_ = auVar150._12_4_;
      auVar92 = minps(auVar223,auVar99);
      auVar210 = maxps(auVar99,auVar150);
      fVar86 = 0.0 - (auVar210._0_4_ + auVar56._0_4_);
      fVar102 = 1.0 - (auVar210._4_4_ + auVar56._4_4_);
      fVar115 = 0.0 - (auVar210._8_4_ + auVar56._8_4_);
      fVar116 = 0.0 - (auVar210._12_4_ + auVar56._12_4_);
      fVar156 = 0.0 - (auVar92._0_4_ + auVar107._0_4_);
      fVar166 = 1.0 - (auVar92._4_4_ + auVar107._4_4_);
      fVar192 = 0.0 - (auVar92._8_4_ + auVar107._8_4_);
      fVar193 = 0.0 - (auVar92._12_4_ + auVar107._12_4_);
      auVar100._0_8_ = CONCAT44(fVar229 * fVar102,fVar227 * fVar86);
      auVar100._8_4_ = fVar235 * fVar115;
      auVar100._12_4_ = fVar236 * fVar116;
      auVar232._0_8_ = CONCAT44(fVar194 * fVar139,fVar219 * fVar139);
      auVar232._8_4_ = fVar220 * fVar139;
      auVar232._12_4_ = fVar206 * fVar139;
      auVar151._0_4_ = fVar139 * fVar117;
      auVar151._4_4_ = fVar139 * fVar208;
      auVar151._8_4_ = fVar139 * fVar165;
      auVar151._12_4_ = fVar139 * fVar207;
      auVar224._8_4_ = auVar232._8_4_;
      auVar224._0_8_ = auVar232._0_8_;
      auVar224._12_4_ = auVar232._12_4_;
      auVar210 = minps(auVar224,auVar151);
      auVar56 = maxps(auVar151,auVar232);
      auVar202._0_8_ = CONCAT44(fVar206 * fVar125,fVar220 * fVar125);
      auVar202._8_4_ = fVar221 * fVar125;
      auVar202._12_4_ = fVar226 * fVar125;
      auVar233._0_4_ = fVar125 * fVar165;
      auVar233._4_4_ = fVar125 * fVar207;
      auVar233._8_4_ = fVar125 * fVar167;
      auVar233._12_4_ = fVar125 * fVar85;
      auVar258._8_4_ = auVar202._8_4_;
      auVar258._0_8_ = auVar202._0_8_;
      auVar258._12_4_ = auVar202._12_4_;
      auVar107 = minps(auVar258,auVar233);
      auVar225._0_4_ = fVar227 * fVar156;
      auVar225._4_4_ = fVar229 * fVar166;
      auVar225._8_4_ = fVar235 * fVar192;
      auVar225._12_4_ = fVar236 * fVar193;
      auVar78._0_8_ = CONCAT44(fVar102 * fVar238,fVar86 * fVar237);
      auVar78._8_4_ = fVar115 * fVar105;
      auVar78._12_4_ = fVar116 * fVar154;
      auVar164._0_4_ = fVar156 * fVar237;
      auVar164._4_4_ = fVar166 * fVar238;
      auVar164._8_4_ = fVar192 * fVar105;
      auVar164._12_4_ = fVar193 * fVar154;
      auVar92 = maxps(auVar233,auVar202);
      fVar85 = 1.0 - (auVar92._0_4_ + auVar56._0_4_);
      fVar86 = 0.0 - (auVar92._4_4_ + auVar56._4_4_);
      fVar102 = 0.0 - (auVar92._8_4_ + auVar56._8_4_);
      fVar115 = 0.0 - (auVar92._12_4_ + auVar56._12_4_);
      fVar116 = 1.0 - (auVar107._0_4_ + auVar210._0_4_);
      fVar117 = 0.0 - (auVar107._4_4_ + auVar210._4_4_);
      fVar156 = 0.0 - (auVar107._8_4_ + auVar210._8_4_);
      fVar165 = 0.0 - (auVar107._12_4_ + auVar210._12_4_);
      auVar203._0_8_ = CONCAT44(fVar229 * fVar86,fVar227 * fVar85);
      auVar203._8_4_ = fVar235 * fVar102;
      auVar203._12_4_ = fVar236 * fVar115;
      auVar245._0_4_ = fVar227 * fVar116;
      auVar245._4_4_ = fVar229 * fVar117;
      auVar245._8_4_ = fVar235 * fVar156;
      auVar245._12_4_ = fVar236 * fVar165;
      auVar152._0_8_ = CONCAT44(fVar86 * fVar238,fVar85 * fVar237);
      auVar152._8_4_ = fVar102 * fVar105;
      auVar152._12_4_ = fVar115 * fVar154;
      auVar218._0_4_ = fVar116 * fVar237;
      auVar218._4_4_ = fVar117 * fVar238;
      auVar218._8_4_ = fVar156 * fVar105;
      auVar218._12_4_ = fVar165 * fVar154;
      auVar234._8_4_ = auVar203._8_4_;
      auVar234._0_8_ = auVar203._0_8_;
      auVar234._12_4_ = auVar203._12_4_;
      auVar56 = minps(auVar234,auVar245);
      auVar255._8_4_ = auVar152._8_4_;
      auVar255._0_8_ = auVar152._0_8_;
      auVar255._12_4_ = auVar152._12_4_;
      auVar210 = minps(auVar255,auVar218);
      auVar212 = minps(auVar56,auVar210);
      auVar210 = maxps(auVar245,auVar203);
      auVar56 = maxps(auVar218,auVar152);
      auVar92 = maxps(auVar56,auVar210);
      auVar204._8_4_ = auVar100._8_4_;
      auVar204._0_8_ = auVar100._0_8_;
      auVar204._12_4_ = auVar100._12_4_;
      auVar210 = minps(auVar204,auVar225);
      auVar153._8_4_ = auVar78._8_4_;
      auVar153._0_8_ = auVar78._0_8_;
      auVar153._12_4_ = auVar78._12_4_;
      auVar56 = minps(auVar153,auVar164);
      auVar210 = minps(auVar210,auVar56);
      auVar107 = maxps(auVar225,auVar100);
      auVar56 = maxps(auVar164,auVar78);
      auVar56 = maxps(auVar56,auVar107);
      auVar205._0_4_ = auVar212._4_4_ + auVar212._0_4_ + local_1cc;
      auVar205._4_4_ = auVar210._4_4_ + auVar210._0_4_ + fStack_1c8;
      auVar205._8_4_ = auVar212._8_4_ + auVar212._4_4_ + fVar118;
      auVar205._12_4_ = auVar212._12_4_ + auVar210._4_4_ + fVar140;
      fVar85 = auVar92._4_4_ + auVar92._0_4_ + local_1cc;
      fVar86 = auVar56._4_4_ + auVar56._0_4_ + fStack_1c8;
      auVar79._4_4_ = fVar86;
      auVar79._0_4_ = fVar85;
      auVar210 = maxps(_local_428,auVar205);
      auVar79._8_4_ = auVar92._8_4_ + auVar92._4_4_ + fVar118;
      auVar79._12_4_ = auVar92._12_4_ + auVar56._4_4_ + fVar140;
      auVar56 = minps(auVar79,auVar191);
      iVar42 = -(uint)(auVar56._0_4_ < auVar210._0_4_);
      iVar44 = -(uint)(auVar56._4_4_ < auVar210._4_4_);
      auVar81._4_4_ = iVar44;
      auVar81._0_4_ = iVar42;
      auVar81._8_4_ = iVar44;
      auVar81._12_4_ = iVar44;
      auVar80._8_8_ = auVar81._8_8_;
      auVar80._4_4_ = iVar42;
      auVar80._0_4_ = iVar42;
      iVar42 = movmskpd((uint)(fVar104 < 0.0),auVar80);
      auVar254 = _DAT_01f7b6c0;
      if (iVar42 == 0) {
        bVar35 = 0;
        if ((local_398 < auVar205._0_4_) && (fVar85 < fStack_394)) {
          bVar35 = -(fVar86 < fStack_41c) & (float)local_428._4_4_ < auVar205._4_4_;
        }
        bVar35 = bVar40 | bVar35;
        uVar37 = (ulong)CONCAT31(uVar15,bVar35);
        if (bVar35 != 1) goto LAB_00a8d577;
        local_298.ray = (RTCRayN *)&DAT_000000c8;
        do {
          fVar48 = 1.0 - local_1cc;
          fVar102 = local_1cc * local_1cc * local_1cc;
          fVar86 = local_1cc * local_1cc * 3.0 * fVar48;
          fVar84 = fVar48 * fVar48 * fVar48;
          fVar104 = local_1cc * 3.0 * fVar48 * fVar48;
          fVar85 = fVar84 * local_3ec.m128[1] +
                   fVar104 * (float)local_388._0_4_ +
                   fVar86 * (float)local_1f8 + fVar102 * (float)local_88._0_4_;
          fVar48 = fVar84 * local_3ec.m128[2] +
                   fVar104 * (float)local_388._4_4_ +
                   fVar86 * local_1f8._4_4_ + fVar102 * (float)local_88._4_4_;
          fVar85 = ((fVar84 * local_3ec.m128[3] +
                    fVar104 * fStack_380 + fVar86 * fStack_1f0 + fVar102 * fStack_80) - fVar85) *
                   fStack_1c8 + fVar85;
          fVar48 = ((fVar84 * fStack_3dc +
                    fVar104 * fStack_37c + fVar86 * fStack_1ec + fVar102 * fStack_7c) - fVar48) *
                   fStack_1c8 + fVar48;
          local_1cc = local_1cc - (fVar48 * fVar125 + fVar85 * fVar139);
          fStack_1c8 = fStack_1c8 - (fVar48 * fVar138 + fVar85 * fVar155);
          fVar85 = (float)((uint)fVar85 & (uint)DAT_01f7b6c0);
          fVar48 = (float)((uint)fVar48 & DAT_01f7b6c0._4_4_);
          if (fVar48 <= fVar85) {
            fVar48 = fVar85;
          }
          if (fVar48 < local_98) {
            if ((((local_1cc < 0.0) || (1.0 < local_1cc)) || (fStack_1c8 < 0.0)) ||
               (1.0 < fStack_1c8)) break;
            fVar48 = (pre->ray_space).vx.field_0.m128[2];
            fVar84 = (pre->ray_space).vy.field_0.m128[2];
            fVar85 = (pre->ray_space).vz.field_0.m128[2];
            fVar86 = (paVar34->field_1).x;
            fVar102 = (paVar34->field_1).y;
            fVar104 = (paVar34->field_1).z;
            fVar125 = 1.0 - fStack_1c8;
            fVar124 = 1.0 - local_1cc;
            fVar115 = fVar124 * fVar124 * fVar124;
            fVar116 = local_1cc * 3.0 * fVar124 * fVar124;
            fVar123 = local_1cc * local_1cc * local_1cc;
            fVar118 = local_1cc * local_1cc * 3.0 * fVar124;
            fVar48 = (((fStack_330 - fVar104) * fVar85 +
                      (fStack_334 - fVar102) * fVar84 + (local_338 - fVar86) * fVar48) * fVar125 +
                     ((fStack_320 - fVar104) * fVar85 +
                     (fStack_324 - fVar102) * fVar84 + (local_328 - fVar86) * fVar48) * fStack_1c8)
                     * fVar115 +
                     (((fStack_340 - fVar104) * fVar85 +
                      (fStack_344 - fVar102) * fVar84 + (local_348 - fVar86) * fVar48) * fVar125 +
                     ((fStack_200 - fVar104) * fVar85 +
                     (fStack_204 - fVar102) * fVar84 + (local_208 - fVar86) * fVar48) * fStack_1c8)
                     * fVar116 +
                     (((fStack_360 - fVar104) * fVar85 +
                      (fStack_364 - fVar102) * fVar84 + (local_368 - fVar86) * fVar48) * fVar125 +
                     ((fStack_370 - fVar104) * fVar85 +
                     (fStack_374 - fVar102) * fVar84 + (local_378 - fVar86) * fVar48) * fStack_1c8)
                     * fVar118 +
                     (fVar125 * ((fStack_350 - fVar104) * fVar85 +
                                (fStack_354 - fVar102) * fVar84 + (local_358 - fVar86) * fVar48) +
                     ((fStack_3b0 - fVar104) * fVar85 +
                     (fStack_3b4 - fVar102) * fVar84 + (local_3b8 - fVar86) * fVar48) * fStack_1c8)
                     * fVar123;
            if (fVar48 < (paVar34->field_1).field_3.w) break;
            fVar84 = (&paVar34->field_1)[2].x;
            auVar254 = ZEXT416((uint)fVar84);
            if (fVar84 < fVar48) break;
            fVar104 = 1.0 - fStack_1c8;
            fVar125 = 1.0 - fStack_1c8;
            fVar138 = 1.0 - fStack_1c8;
            fVar85 = local_348 * fVar104 + local_208 * fStack_1c8;
            fVar86 = fStack_344 * fVar125 + fStack_204 * fStack_1c8;
            fVar102 = fStack_340 * fVar138 + fStack_200 * fStack_1c8;
            fVar139 = local_368 * fVar104 + local_378 * fStack_1c8;
            fVar105 = fStack_364 * fVar125 + fStack_374 * fStack_1c8;
            fVar155 = fStack_360 * fVar138 + fStack_370 * fStack_1c8;
            fVar140 = fVar139 - fVar85;
            fVar154 = fVar105 - fVar86;
            fVar117 = fVar155 - fVar102;
            fVar85 = (((fVar85 - (local_338 * fVar104 + local_328 * fStack_1c8)) * fVar124 +
                      local_1cc * fVar140) * fVar124 +
                     (fVar140 * fVar124 +
                     ((fVar104 * local_358 + fStack_1c8 * local_3b8) - fVar139) * local_1cc) *
                     local_1cc) * 3.0;
            fVar86 = (((fVar86 - (fStack_334 * fVar125 + fStack_324 * fStack_1c8)) * fVar124 +
                      local_1cc * fVar154) * fVar124 +
                     (fVar154 * fVar124 +
                     ((fVar125 * fStack_354 + fStack_1c8 * fStack_3b4) - fVar105) * local_1cc) *
                     local_1cc) * 3.0;
            fVar102 = (((fVar102 - (fStack_330 * fVar138 + fStack_320 * fStack_1c8)) * fVar124 +
                       local_1cc * fVar117) * fVar124 +
                      (fVar117 * fVar124 +
                      ((fVar138 * fStack_350 + fStack_1c8 * fStack_3b0) - fVar155) * local_1cc) *
                      local_1cc) * 3.0;
            pGVar5 = (context->scene->geometries).items[(uint)fVar103].ptr;
            local_298.ray = (RTCRayN *)(ulong)(uint)(&paVar34->field_1)[2].y;
            if ((pGVar5->mask & (uint)(&paVar34->field_1)[2].y) == 0) break;
            fVar104 = fVar115 * local_168 +
                      fVar116 * local_178 + fVar118 * local_188 + fVar123 * local_198;
            fVar124 = fVar115 * fStack_164 +
                      fVar116 * fStack_174 + fVar118 * fStack_184 + fVar123 * fStack_194;
            fVar115 = fVar115 * fStack_160 +
                      fVar116 * fStack_170 + fVar118 * fStack_180 + fVar123 * fStack_190;
            local_1d0 = fVar124 * fVar85 - fVar86 * fVar104;
            local_1d8 = CONCAT44(fVar104 * fVar102 - fVar85 * fVar115,
                                 fVar115 * fVar86 - fVar102 * fVar124);
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              (&paVar34->field_1)[2].x = fVar48;
              *(undefined8 *)(paVar34->m128 + 0xc) = local_1d8;
              paVar34->m128[0xe] = local_1d0;
              paVar34->m128[0xf] = local_1cc;
              paVar34->m128[0x10] = fStack_1c8;
              paVar34->m128[0x11] = (float)local_3c0;
              paVar34->m128[0x12] = fVar103;
              paVar34->m128[0x13] = (float)context->user->instID[0];
              fVar48 = (float)context->user->instPrimID[0];
              local_298.ray = (RTCRayN *)(ulong)(uint)fVar48;
              paVar34->m128[0x14] = fVar48;
              break;
            }
            local_1c4 = (float)local_3c0;
            local_1c0 = fVar103;
            local_1bc = context->user->instID[0];
            local_1b8 = context->user->instPrimID[0];
            (&paVar34->field_1)[2].x = fVar48;
            local_3ec.m128[0] = -NAN;
            local_298.valid = (int *)&local_3ec;
            local_298.geometryUserPtr = pGVar5->userPtr;
            local_298.context = context->user;
            local_298.ray = (RTCRayN *)paVar34;
            local_298.hit = (RTCHitN *)&local_1d8;
            local_298.N = 1;
            if ((pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
               ((*pGVar5->intersectionFilterN)(&local_298), *(float *)local_298.valid != 0.0)) {
              p_Var6 = context->args->filter;
              if ((p_Var6 == (RTCFilterFunctionN)0x0) ||
                 ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                    RTC_RAY_QUERY_FLAG_INCOHERENT && (((pGVar5->field_8).field_0x2 & 0x40) == 0)) ||
                  ((*p_Var6)(&local_298), *(float *)local_298.valid != 0.0)))) {
                *(float *)((long)local_298.ray + 0x30) = *(float *)local_298.hit;
                *(float *)((long)local_298.ray + 0x34) = *(float *)(local_298.hit + 4);
                *(float *)((long)local_298.ray + 0x38) = *(float *)(local_298.hit + 8);
                *(float *)((long)local_298.ray + 0x3c) = *(float *)(local_298.hit + 0xc);
                *(float *)((long)local_298.ray + 0x40) = *(float *)(local_298.hit + 0x10);
                *(float *)((long)local_298.ray + 0x44) = *(float *)(local_298.hit + 0x14);
                *(float *)((long)local_298.ray + 0x48) = *(float *)(local_298.hit + 0x18);
                *(float *)((long)local_298.ray + 0x4c) = *(float *)(local_298.hit + 0x1c);
                *(float *)((long)local_298.ray + 0x50) = *(float *)(local_298.hit + 0x20);
                break;
              }
            }
            (&paVar34->field_1)[2].x = fVar84;
            local_298.ray = (RTCRayN *)local_298.valid;
            break;
          }
          local_298.ray = (RTCRayN *)((long)local_298.ray + -1);
        } while (local_298.ray != (RTCRayN *)0x0);
      }
    }
  }
  goto LAB_00a8dbde;
}

Assistant:

static __forceinline void intersect_n(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          
          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }